

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  code *pcVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined8 uVar30;
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  long lVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  byte bVar98;
  byte bVar99;
  ulong uVar100;
  uint uVar101;
  uint uVar102;
  ulong uVar103;
  ulong uVar104;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  long lVar105;
  uint uVar106;
  ulong uVar107;
  byte bVar108;
  float fVar109;
  float fVar110;
  float fVar161;
  float fVar162;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar117 [16];
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar164;
  float fVar167;
  float fVar168;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar169;
  undefined4 uVar170;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined8 uVar171;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar189;
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  undefined1 auVar199 [64];
  float fVar201;
  float fVar206;
  float fVar207;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  uint uVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_940;
  long local_910;
  undefined1 (*local_908) [32];
  undefined1 local_900 [32];
  undefined1 local_8d0 [8];
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  float local_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined4 local_7f0;
  undefined4 uStack_7ec;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  uint local_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  uint uStack_7b0;
  uint uStack_7ac;
  uint uStack_7a8;
  uint uStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar9 = prim[1];
  uVar104 = (ulong)(byte)PVar9;
  lVar79 = uVar104 * 0x19;
  fVar201 = *(float *)(prim + lVar79 + 0x12);
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar114 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar115 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar116 = vsubps_avx(auVar29,*(undefined1 (*) [16])(prim + lVar79 + 6));
  fVar189 = fVar201 * auVar116._0_4_;
  fVar169 = fVar201 * auVar115._0_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar104 * 4 + 6);
  auVar123 = vpmovsxbd_avx2(auVar29);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar104 * 5 + 6);
  auVar121 = vpmovsxbd_avx2(auVar114);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar104 * 6 + 6);
  auVar133 = vpmovsxbd_avx2(auVar113);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 6);
  auVar134 = vpmovsxbd_avx2(auVar111);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar130 = vpmovsxbd_avx2(auVar233);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar132 = vcvtdq2ps_avx(auVar130);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar104 + 6);
  auVar122 = vpmovsxbd_avx2(auVar6);
  auVar122 = vcvtdq2ps_avx(auVar122);
  uVar107 = (ulong)(uint)((int)(uVar104 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar107 + 6);
  auVar124 = vpmovsxbd_avx2(auVar7);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar107 + uVar104 + 6);
  auVar125 = vpmovsxbd_avx2(auVar8);
  auVar125 = vcvtdq2ps_avx(auVar125);
  uVar100 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar100 + 6);
  auVar120 = vpmovsxbd_avx2(auVar112);
  auVar131 = vcvtdq2ps_avx(auVar120);
  auVar225._4_4_ = fVar169;
  auVar225._0_4_ = fVar169;
  auVar225._8_4_ = fVar169;
  auVar225._12_4_ = fVar169;
  auVar225._16_4_ = fVar169;
  auVar225._20_4_ = fVar169;
  auVar225._24_4_ = fVar169;
  auVar225._28_4_ = fVar169;
  auVar227._8_4_ = 1;
  auVar227._0_8_ = 0x100000001;
  auVar227._12_4_ = 1;
  auVar227._16_4_ = 1;
  auVar227._20_4_ = 1;
  auVar227._24_4_ = 1;
  auVar227._28_4_ = 1;
  auVar118 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar127 = ZEXT1632(CONCAT412(fVar201 * auVar115._12_4_,
                                CONCAT48(fVar201 * auVar115._8_4_,
                                         CONCAT44(fVar201 * auVar115._4_4_,fVar169))));
  auVar126 = vpermps_avx2(auVar227,auVar127);
  auVar119 = vpermps_avx512vl(auVar118,auVar127);
  fVar169 = auVar119._0_4_;
  fVar206 = auVar119._4_4_;
  auVar127._4_4_ = fVar206 * auVar133._4_4_;
  auVar127._0_4_ = fVar169 * auVar133._0_4_;
  fVar207 = auVar119._8_4_;
  auVar127._8_4_ = fVar207 * auVar133._8_4_;
  fVar190 = auVar119._12_4_;
  auVar127._12_4_ = fVar190 * auVar133._12_4_;
  fVar200 = auVar119._16_4_;
  auVar127._16_4_ = fVar200 * auVar133._16_4_;
  fVar109 = auVar119._20_4_;
  auVar127._20_4_ = fVar109 * auVar133._20_4_;
  fVar110 = auVar119._24_4_;
  auVar127._24_4_ = fVar110 * auVar133._24_4_;
  auVar127._28_4_ = auVar130._28_4_;
  auVar130._4_4_ = auVar122._4_4_ * fVar206;
  auVar130._0_4_ = auVar122._0_4_ * fVar169;
  auVar130._8_4_ = auVar122._8_4_ * fVar207;
  auVar130._12_4_ = auVar122._12_4_ * fVar190;
  auVar130._16_4_ = auVar122._16_4_ * fVar200;
  auVar130._20_4_ = auVar122._20_4_ * fVar109;
  auVar130._24_4_ = auVar122._24_4_ * fVar110;
  auVar130._28_4_ = auVar120._28_4_;
  auVar120._4_4_ = auVar131._4_4_ * fVar206;
  auVar120._0_4_ = auVar131._0_4_ * fVar169;
  auVar120._8_4_ = auVar131._8_4_ * fVar207;
  auVar120._12_4_ = auVar131._12_4_ * fVar190;
  auVar120._16_4_ = auVar131._16_4_ * fVar200;
  auVar120._20_4_ = auVar131._20_4_ * fVar109;
  auVar120._24_4_ = auVar131._24_4_ * fVar110;
  auVar120._28_4_ = auVar119._28_4_;
  auVar29 = vfmadd231ps_fma(auVar127,auVar126,auVar121);
  auVar114 = vfmadd231ps_fma(auVar130,auVar126,auVar132);
  auVar113 = vfmadd231ps_fma(auVar120,auVar125,auVar126);
  auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar225,auVar123);
  auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar225,auVar134);
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar124,auVar225);
  auVar226._4_4_ = fVar189;
  auVar226._0_4_ = fVar189;
  auVar226._8_4_ = fVar189;
  auVar226._12_4_ = fVar189;
  auVar226._16_4_ = fVar189;
  auVar226._20_4_ = fVar189;
  auVar226._24_4_ = fVar189;
  auVar226._28_4_ = fVar189;
  auVar120 = ZEXT1632(CONCAT412(fVar201 * auVar116._12_4_,
                                CONCAT48(fVar201 * auVar116._8_4_,
                                         CONCAT44(fVar201 * auVar116._4_4_,fVar189))));
  auVar130 = vpermps_avx2(auVar227,auVar120);
  auVar120 = vpermps_avx512vl(auVar118,auVar120);
  fVar201 = auVar120._0_4_;
  fVar169 = auVar120._4_4_;
  auVar126._4_4_ = fVar169 * auVar133._4_4_;
  auVar126._0_4_ = fVar201 * auVar133._0_4_;
  fVar206 = auVar120._8_4_;
  auVar126._8_4_ = fVar206 * auVar133._8_4_;
  fVar207 = auVar120._12_4_;
  auVar126._12_4_ = fVar207 * auVar133._12_4_;
  fVar190 = auVar120._16_4_;
  auVar126._16_4_ = fVar190 * auVar133._16_4_;
  fVar200 = auVar120._20_4_;
  auVar126._20_4_ = fVar200 * auVar133._20_4_;
  fVar109 = auVar120._24_4_;
  auVar126._24_4_ = fVar109 * auVar133._24_4_;
  auVar126._28_4_ = 1;
  auVar118._4_4_ = auVar122._4_4_ * fVar169;
  auVar118._0_4_ = auVar122._0_4_ * fVar201;
  auVar118._8_4_ = auVar122._8_4_ * fVar206;
  auVar118._12_4_ = auVar122._12_4_ * fVar207;
  auVar118._16_4_ = auVar122._16_4_ * fVar190;
  auVar118._20_4_ = auVar122._20_4_ * fVar200;
  auVar118._24_4_ = auVar122._24_4_ * fVar109;
  auVar118._28_4_ = auVar133._28_4_;
  auVar122._4_4_ = auVar131._4_4_ * fVar169;
  auVar122._0_4_ = auVar131._0_4_ * fVar201;
  auVar122._8_4_ = auVar131._8_4_ * fVar206;
  auVar122._12_4_ = auVar131._12_4_ * fVar207;
  auVar122._16_4_ = auVar131._16_4_ * fVar190;
  auVar122._20_4_ = auVar131._20_4_ * fVar200;
  auVar122._24_4_ = auVar131._24_4_ * fVar109;
  auVar122._28_4_ = auVar120._28_4_;
  auVar111 = vfmadd231ps_fma(auVar126,auVar130,auVar121);
  auVar233 = vfmadd231ps_fma(auVar118,auVar130,auVar132);
  auVar6 = vfmadd231ps_fma(auVar122,auVar130,auVar125);
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar226,auVar123);
  auVar233 = vfmadd231ps_fma(ZEXT1632(auVar233),auVar226,auVar134);
  auVar217._8_4_ = 0x7fffffff;
  auVar217._0_8_ = 0x7fffffff7fffffff;
  auVar217._12_4_ = 0x7fffffff;
  auVar217._16_4_ = 0x7fffffff;
  auVar217._20_4_ = 0x7fffffff;
  auVar217._24_4_ = 0x7fffffff;
  auVar217._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar226,auVar124);
  auVar123 = vandps_avx(ZEXT1632(auVar29),auVar217);
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar214._16_4_ = 0x219392ef;
  auVar214._20_4_ = 0x219392ef;
  auVar214._24_4_ = 0x219392ef;
  auVar214._28_4_ = 0x219392ef;
  uVar107 = vcmpps_avx512vl(auVar123,auVar214,1);
  bVar15 = (bool)((byte)uVar107 & 1);
  auVar119._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar29._0_4_;
  bVar15 = (bool)((byte)(uVar107 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar29._4_4_;
  bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar29._8_4_;
  bVar15 = (bool)((byte)(uVar107 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar29._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar107 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar107 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar107 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar107 >> 7) * 0x219392ef;
  auVar123 = vandps_avx(ZEXT1632(auVar114),auVar217);
  uVar107 = vcmpps_avx512vl(auVar123,auVar214,1);
  bVar15 = (bool)((byte)uVar107 & 1);
  auVar128._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar114._0_4_;
  bVar15 = (bool)((byte)(uVar107 >> 1) & 1);
  auVar128._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar114._4_4_;
  bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
  auVar128._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar114._8_4_;
  bVar15 = (bool)((byte)(uVar107 >> 3) & 1);
  auVar128._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar114._12_4_;
  auVar128._16_4_ = (uint)((byte)(uVar107 >> 4) & 1) * 0x219392ef;
  auVar128._20_4_ = (uint)((byte)(uVar107 >> 5) & 1) * 0x219392ef;
  auVar128._24_4_ = (uint)((byte)(uVar107 >> 6) & 1) * 0x219392ef;
  auVar128._28_4_ = (uint)(byte)(uVar107 >> 7) * 0x219392ef;
  auVar123 = vandps_avx(ZEXT1632(auVar113),auVar217);
  uVar107 = vcmpps_avx512vl(auVar123,auVar214,1);
  bVar15 = (bool)((byte)uVar107 & 1);
  auVar123._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar113._0_4_;
  bVar15 = (bool)((byte)(uVar107 >> 1) & 1);
  auVar123._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar113._4_4_;
  bVar15 = (bool)((byte)(uVar107 >> 2) & 1);
  auVar123._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar113._8_4_;
  bVar15 = (bool)((byte)(uVar107 >> 3) & 1);
  auVar123._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar113._12_4_;
  auVar123._16_4_ = (uint)((byte)(uVar107 >> 4) & 1) * 0x219392ef;
  auVar123._20_4_ = (uint)((byte)(uVar107 >> 5) & 1) * 0x219392ef;
  auVar123._24_4_ = (uint)((byte)(uVar107 >> 6) & 1) * 0x219392ef;
  auVar123._28_4_ = (uint)(byte)(uVar107 >> 7) * 0x219392ef;
  auVar121 = vrcp14ps_avx512vl(auVar119);
  auVar215._8_4_ = 0x3f800000;
  auVar215._0_8_ = &DAT_3f8000003f800000;
  auVar215._12_4_ = 0x3f800000;
  auVar215._16_4_ = 0x3f800000;
  auVar215._20_4_ = 0x3f800000;
  auVar215._24_4_ = 0x3f800000;
  auVar215._28_4_ = 0x3f800000;
  auVar29 = vfnmadd213ps_fma(auVar119,auVar121,auVar215);
  auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar121,auVar121);
  auVar121 = vrcp14ps_avx512vl(auVar128);
  auVar114 = vfnmadd213ps_fma(auVar128,auVar121,auVar215);
  auVar114 = vfmadd132ps_fma(ZEXT1632(auVar114),auVar121,auVar121);
  auVar121 = vrcp14ps_avx512vl(auVar123);
  auVar113 = vfnmadd213ps_fma(auVar123,auVar121,auVar215);
  auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar121,auVar121);
  auVar123 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 7 + 6));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar123 = vsubps_avx(auVar123,ZEXT1632(auVar111));
  auVar124._4_4_ = auVar29._4_4_ * auVar123._4_4_;
  auVar124._0_4_ = auVar29._0_4_ * auVar123._0_4_;
  auVar124._8_4_ = auVar29._8_4_ * auVar123._8_4_;
  auVar124._12_4_ = auVar29._12_4_ * auVar123._12_4_;
  auVar124._16_4_ = auVar123._16_4_ * 0.0;
  auVar124._20_4_ = auVar123._20_4_ * 0.0;
  auVar124._24_4_ = auVar123._24_4_ * 0.0;
  auVar124._28_4_ = auVar123._28_4_;
  auVar123 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 9 + 6));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar123 = vsubps_avx(auVar123,ZEXT1632(auVar111));
  auVar122 = vpbroadcastd_avx512vl();
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar147._0_4_ = auVar29._0_4_ * auVar123._0_4_;
  auVar147._4_4_ = auVar29._4_4_ * auVar123._4_4_;
  auVar147._8_4_ = auVar29._8_4_ * auVar123._8_4_;
  auVar147._12_4_ = auVar29._12_4_ * auVar123._12_4_;
  auVar147._16_4_ = auVar123._16_4_ * 0.0;
  auVar147._20_4_ = auVar123._20_4_ * 0.0;
  auVar147._24_4_ = auVar123._24_4_ * 0.0;
  auVar147._28_4_ = 0;
  auVar123 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar104 * -2 + 6));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar123 = vsubps_avx(auVar123,ZEXT1632(auVar233));
  auVar125._4_4_ = auVar114._4_4_ * auVar123._4_4_;
  auVar125._0_4_ = auVar114._0_4_ * auVar123._0_4_;
  auVar125._8_4_ = auVar114._8_4_ * auVar123._8_4_;
  auVar125._12_4_ = auVar114._12_4_ * auVar123._12_4_;
  auVar125._16_4_ = auVar123._16_4_ * 0.0;
  auVar125._20_4_ = auVar123._20_4_ * 0.0;
  auVar125._24_4_ = auVar123._24_4_ * 0.0;
  auVar125._28_4_ = auVar123._28_4_;
  auVar216 = ZEXT3264(auVar125);
  auVar123 = vcvtdq2ps_avx(auVar121);
  auVar123 = vsubps_avx(auVar123,ZEXT1632(auVar233));
  auVar146._0_4_ = auVar114._0_4_ * auVar123._0_4_;
  auVar146._4_4_ = auVar114._4_4_ * auVar123._4_4_;
  auVar146._8_4_ = auVar114._8_4_ * auVar123._8_4_;
  auVar146._12_4_ = auVar114._12_4_ * auVar123._12_4_;
  auVar146._16_4_ = auVar123._16_4_ * 0.0;
  auVar146._20_4_ = auVar123._20_4_ * 0.0;
  auVar146._24_4_ = auVar123._24_4_ * 0.0;
  auVar146._28_4_ = 0;
  auVar123 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 + uVar104 + 6));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar123 = vsubps_avx(auVar123,ZEXT1632(auVar6));
  auVar131._4_4_ = auVar123._4_4_ * auVar113._4_4_;
  auVar131._0_4_ = auVar123._0_4_ * auVar113._0_4_;
  auVar131._8_4_ = auVar123._8_4_ * auVar113._8_4_;
  auVar131._12_4_ = auVar123._12_4_ * auVar113._12_4_;
  auVar131._16_4_ = auVar123._16_4_ * 0.0;
  auVar131._20_4_ = auVar123._20_4_ * 0.0;
  auVar131._24_4_ = auVar123._24_4_ * 0.0;
  auVar131._28_4_ = auVar123._28_4_;
  auVar123 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x17 + 6));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar123 = vsubps_avx(auVar123,ZEXT1632(auVar6));
  auVar129._0_4_ = auVar113._0_4_ * auVar123._0_4_;
  auVar129._4_4_ = auVar113._4_4_ * auVar123._4_4_;
  auVar129._8_4_ = auVar113._8_4_ * auVar123._8_4_;
  auVar129._12_4_ = auVar113._12_4_ * auVar123._12_4_;
  auVar129._16_4_ = auVar123._16_4_ * 0.0;
  auVar129._20_4_ = auVar123._20_4_ * 0.0;
  auVar129._24_4_ = auVar123._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar123 = vpminsd_avx2(auVar124,auVar147);
  auVar121 = vpminsd_avx2(auVar125,auVar146);
  auVar123 = vmaxps_avx(auVar123,auVar121);
  auVar121 = vpminsd_avx2(auVar131,auVar129);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar133._4_4_ = uVar3;
  auVar133._0_4_ = uVar3;
  auVar133._8_4_ = uVar3;
  auVar133._12_4_ = uVar3;
  auVar133._16_4_ = uVar3;
  auVar133._20_4_ = uVar3;
  auVar133._24_4_ = uVar3;
  auVar133._28_4_ = uVar3;
  auVar121 = vmaxps_avx512vl(auVar121,auVar133);
  auVar123 = vmaxps_avx(auVar123,auVar121);
  auVar121._8_4_ = 0x3f7ffffa;
  auVar121._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar121._12_4_ = 0x3f7ffffa;
  auVar121._16_4_ = 0x3f7ffffa;
  auVar121._20_4_ = 0x3f7ffffa;
  auVar121._24_4_ = 0x3f7ffffa;
  auVar121._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar123,auVar121);
  auVar199 = ZEXT3264(local_320);
  auVar123 = vpmaxsd_avx2(auVar124,auVar147);
  auVar121 = vpmaxsd_avx2(auVar125,auVar146);
  auVar123 = vminps_avx(auVar123,auVar121);
  auVar121 = vpmaxsd_avx2(auVar131,auVar129);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar134._4_4_ = uVar3;
  auVar134._0_4_ = uVar3;
  auVar134._8_4_ = uVar3;
  auVar134._12_4_ = uVar3;
  auVar134._16_4_ = uVar3;
  auVar134._20_4_ = uVar3;
  auVar134._24_4_ = uVar3;
  auVar134._28_4_ = uVar3;
  auVar121 = vminps_avx512vl(auVar121,auVar134);
  auVar123 = vminps_avx(auVar123,auVar121);
  auVar132._8_4_ = 0x3f800003;
  auVar132._0_8_ = 0x3f8000033f800003;
  auVar132._12_4_ = 0x3f800003;
  auVar132._16_4_ = 0x3f800003;
  auVar132._20_4_ = 0x3f800003;
  auVar132._24_4_ = 0x3f800003;
  auVar132._28_4_ = 0x3f800003;
  auVar123 = vmulps_avx512vl(auVar123,auVar132);
  uVar30 = vpcmpgtd_avx512vl(auVar122,_DAT_0205a920);
  uVar171 = vcmpps_avx512vl(local_320,auVar123,2);
  if ((byte)((byte)uVar171 & (byte)uVar30) != 0) {
    uVar107 = (ulong)(byte)((byte)uVar171 & (byte)uVar30);
    local_908 = (undefined1 (*) [32])local_100;
    auVar183 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar183);
    do {
      auVar121 = auVar216._0_32_;
      auVar123 = auVar199._0_32_;
      local_860 = in_ZMM21._0_32_;
      local_840 = in_ZMM20._0_32_;
      lVar31 = 0;
      for (uVar100 = uVar107; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar107 = uVar107 - 1 & uVar107;
      uVar3 = *(undefined4 *)(prim + lVar31 * 4 + 6);
      uVar100 = (ulong)(uint)((int)lVar31 << 6);
      uVar106 = *(uint *)(prim + 2);
      pGVar12 = (context->scene->geometries).items[uVar106].ptr;
      auVar29 = *(undefined1 (*) [16])(prim + uVar100 + lVar79 + 0x16);
      if (uVar107 != 0) {
        uVar103 = uVar107 - 1 & uVar107;
        for (uVar104 = uVar107; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
        }
        if (uVar103 != 0) {
          for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_8b0 = *(undefined1 (*) [16])(prim + uVar100 + lVar79 + 0x26);
      local_8c0 = *(undefined1 (*) [16])(prim + uVar100 + lVar79 + 0x36);
      _local_8d0 = *(undefined1 (*) [16])(prim + uVar100 + lVar79 + 0x46);
      local_7c0 = (uint)pGVar12;
      uStack_7bc = (uint)((ulong)pGVar12 >> 0x20);
      iVar10 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar114 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar111 = vsubps_avx512vl(auVar29,auVar114);
      uVar170 = auVar111._0_4_;
      auVar115._4_4_ = uVar170;
      auVar115._0_4_ = uVar170;
      auVar115._8_4_ = uVar170;
      auVar115._12_4_ = uVar170;
      auVar113 = vshufps_avx(auVar111,auVar111,0x55);
      auVar111 = vshufps_avx(auVar111,auVar111,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar201 = pre->ray_space[k].vz.field_0.m128[0];
      fVar169 = pre->ray_space[k].vz.field_0.m128[1];
      fVar206 = pre->ray_space[k].vz.field_0.m128[2];
      fVar207 = pre->ray_space[k].vz.field_0.m128[3];
      auVar220._0_4_ = fVar201 * auVar111._0_4_;
      auVar220._4_4_ = fVar169 * auVar111._4_4_;
      auVar220._8_4_ = fVar206 * auVar111._8_4_;
      auVar220._12_4_ = fVar207 * auVar111._12_4_;
      auVar113 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar113);
      auVar233 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar115);
      auVar112 = vshufps_avx512vl(auVar29,auVar29,0xff);
      auVar111 = vsubps_avx(local_8b0,auVar114);
      uVar170 = auVar111._0_4_;
      auVar191._4_4_ = uVar170;
      auVar191._0_4_ = uVar170;
      auVar191._8_4_ = uVar170;
      auVar191._12_4_ = uVar170;
      auVar113 = vshufps_avx(auVar111,auVar111,0x55);
      auVar111 = vshufps_avx(auVar111,auVar111,0xaa);
      auVar117._0_4_ = fVar201 * auVar111._0_4_;
      auVar117._4_4_ = fVar169 * auVar111._4_4_;
      auVar117._8_4_ = fVar206 * auVar111._8_4_;
      auVar117._12_4_ = fVar207 * auVar111._12_4_;
      auVar113 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar5,auVar113);
      auVar6 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar191);
      auVar111 = vsubps_avx512vl(local_8c0,auVar114);
      uVar170 = auVar111._0_4_;
      auVar192._4_4_ = uVar170;
      auVar192._0_4_ = uVar170;
      auVar192._8_4_ = uVar170;
      auVar192._12_4_ = uVar170;
      auVar113 = vshufps_avx(auVar111,auVar111,0x55);
      auVar111 = vshufps_avx(auVar111,auVar111,0xaa);
      auVar222._0_4_ = fVar201 * auVar111._0_4_;
      auVar222._4_4_ = fVar169 * auVar111._4_4_;
      auVar222._8_4_ = fVar206 * auVar111._8_4_;
      auVar222._12_4_ = fVar207 * auVar111._12_4_;
      auVar113 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar5,auVar113);
      auVar111 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar192);
      auVar113 = vsubps_avx512vl(_local_8d0,auVar114);
      uVar170 = auVar113._0_4_;
      auVar116._4_4_ = uVar170;
      auVar116._0_4_ = uVar170;
      auVar116._8_4_ = uVar170;
      auVar116._12_4_ = uVar170;
      auVar114 = vshufps_avx(auVar113,auVar113,0x55);
      auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
      auVar223._0_4_ = fVar201 * auVar113._0_4_;
      auVar223._4_4_ = fVar169 * auVar113._4_4_;
      auVar223._8_4_ = fVar206 * auVar113._8_4_;
      auVar223._12_4_ = fVar207 * auVar113._12_4_;
      auVar114 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar114);
      auVar7 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar4,auVar116);
      lVar31 = (long)iVar10 * 0x44;
      auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar31);
      uVar170 = auVar233._0_4_;
      local_760._4_4_ = uVar170;
      local_760._0_4_ = uVar170;
      local_760._8_4_ = uVar170;
      local_760._12_4_ = uVar170;
      local_760._16_4_ = uVar170;
      local_760._20_4_ = uVar170;
      local_760._24_4_ = uVar170;
      local_760._28_4_ = uVar170;
      auVar184._8_4_ = 1;
      auVar184._0_8_ = 0x100000001;
      auVar184._12_4_ = 1;
      auVar184._16_4_ = 1;
      auVar184._20_4_ = 1;
      auVar184._24_4_ = 1;
      auVar184._28_4_ = 1;
      local_780 = vpermps_avx512vl(auVar184,ZEXT1632(auVar233));
      auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x484);
      local_900 = vbroadcastss_avx512vl(auVar6);
      local_580 = vpermps_avx2(auVar184,ZEXT1632(auVar6));
      auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x908);
      local_340 = vbroadcastss_avx512vl(auVar111);
      local_360 = vpermps_avx512vl(auVar184,ZEXT1632(auVar111));
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0xd8c);
      local_880 = vbroadcastss_avx512vl(auVar7);
      auVar183 = ZEXT3264(local_880);
      local_8a0 = vpermps_avx512vl(auVar184,ZEXT1632(auVar7));
      auVar235 = ZEXT3264(local_8a0);
      auVar124 = vmulps_avx512vl(local_880,auVar122);
      auVar125 = vmulps_avx512vl(local_8a0,auVar122);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar132,local_340);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar132,local_360);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar134,local_900);
      auVar114 = vfmadd231ps_fma(auVar125,auVar134,local_580);
      auVar120 = vfmadd231ps_avx512vl(auVar124,auVar133,local_760);
      auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar133,local_780);
      auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar31);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x484);
      auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x908);
      auVar130 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0xd8c);
      auVar127 = vmulps_avx512vl(local_880,auVar130);
      auVar118 = vmulps_avx512vl(local_8a0,auVar130);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar131,local_340);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar131,local_360);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar125,local_900);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar125,local_580);
      auVar8 = vfmadd231ps_fma(auVar127,auVar124,local_760);
      auVar127 = vfmadd231ps_avx512vl(auVar118,auVar124,local_780);
      local_740 = vsubps_avx512vl(ZEXT1632(auVar8),auVar120);
      local_7a0 = vsubps_avx(auVar127,auVar126);
      auVar118 = vmulps_avx512vl(auVar126,local_740);
      auVar119 = vmulps_avx512vl(auVar120,local_7a0);
      auVar118 = vsubps_avx512vl(auVar118,auVar119);
      auVar114 = vshufps_avx(local_8b0,local_8b0,0xff);
      uVar171 = auVar112._0_8_;
      local_380._8_8_ = uVar171;
      local_380._0_8_ = uVar171;
      local_380._16_8_ = uVar171;
      local_380._24_8_ = uVar171;
      local_3a0 = vbroadcastsd_avx512vl(auVar114);
      auVar114 = vshufps_avx512vl(local_8c0,local_8c0,0xff);
      local_3c0 = vbroadcastsd_avx512vl(auVar114);
      auVar114 = vshufps_avx512vl(_local_8d0,_local_8d0,0xff);
      uVar171 = auVar114._0_8_;
      register0x00001248 = uVar171;
      local_3e0 = uVar171;
      register0x00001250 = uVar171;
      register0x00001258 = uVar171;
      auVar119 = vmulps_avx512vl(_local_3e0,auVar122);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar132,local_3c0);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar134,local_3a0);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar133,local_380);
      auVar128 = vmulps_avx512vl(_local_3e0,auVar130);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar131,local_3c0);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,local_3a0);
      auVar112 = vfmadd231ps_fma(auVar128,auVar124,local_380);
      auVar128 = vmulps_avx512vl(local_7a0,local_7a0);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_740,local_740);
      auVar129 = vmaxps_avx512vl(auVar119,ZEXT1632(auVar112));
      auVar129 = vmulps_avx512vl(auVar129,auVar129);
      auVar128 = vmulps_avx512vl(auVar129,auVar128);
      auVar118 = vmulps_avx512vl(auVar118,auVar118);
      uVar171 = vcmpps_avx512vl(auVar118,auVar128,2);
      auVar114 = vblendps_avx(auVar233,auVar29,8);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar113 = vandps_avx512vl(auVar114,auVar115);
      auVar114 = vblendps_avx(auVar6,local_8b0,8);
      auVar114 = vandps_avx512vl(auVar114,auVar115);
      auVar113 = vmaxps_avx(auVar113,auVar114);
      auVar114 = vblendps_avx(auVar111,local_8c0,8);
      auVar116 = vandps_avx512vl(auVar114,auVar115);
      auVar114 = vblendps_avx(auVar7,_local_8d0,8);
      auVar114 = vandps_avx512vl(auVar114,auVar115);
      auVar114 = vmaxps_avx(auVar116,auVar114);
      auVar114 = vmaxps_avx(auVar113,auVar114);
      auVar113 = vmovshdup_avx(auVar114);
      auVar113 = vmaxss_avx(auVar113,auVar114);
      auVar114 = vshufpd_avx(auVar114,auVar114,1);
      auVar114 = vmaxss_avx(auVar114,auVar113);
      auVar113 = vcvtsi2ss_avx512f(_local_8d0,iVar10);
      local_540._0_16_ = auVar113;
      auVar224._0_4_ = auVar113._0_4_;
      auVar224._4_4_ = auVar224._0_4_;
      auVar224._8_4_ = auVar224._0_4_;
      auVar224._12_4_ = auVar224._0_4_;
      auVar224._16_4_ = auVar224._0_4_;
      auVar224._20_4_ = auVar224._0_4_;
      auVar224._24_4_ = auVar224._0_4_;
      auVar224._28_4_ = auVar224._0_4_;
      uVar30 = vcmpps_avx512vl(auVar224,_DAT_02020f40,0xe);
      bVar108 = (byte)uVar171 & (byte)uVar30;
      auVar114 = vmulss_avx512f(auVar114,ZEXT416(0x35000000));
      auVar197._8_4_ = 2;
      auVar197._0_8_ = 0x200000002;
      auVar197._12_4_ = 2;
      auVar197._16_4_ = 2;
      auVar197._20_4_ = 2;
      auVar197._24_4_ = 2;
      auVar197._28_4_ = 2;
      local_400 = vpermps_avx512vl(auVar197,ZEXT1632(auVar233));
      local_420 = vpermps_avx512vl(auVar197,ZEXT1632(auVar6));
      local_440 = vpermps_avx512vl(auVar197,ZEXT1632(auVar111));
      local_460 = vpermps_avx2(auVar197,ZEXT1632(auVar7));
      uVar219 = *(uint *)(ray + k * 4 + 0xc0);
      auVar113 = local_740._0_16_;
      if (bVar108 == 0) {
        auVar113 = vxorps_avx512vl(auVar113,auVar113);
        auVar234 = ZEXT1664(auVar113);
        auVar216 = ZEXT3264(auVar121);
        in_ZMM20 = ZEXT3264(local_840);
        auVar199 = ZEXT3264(auVar123);
        in_ZMM21 = ZEXT3264(local_860);
        auVar232 = ZEXT3264(local_760);
        auVar231 = ZEXT3264(local_780);
        auVar230 = ZEXT3264(local_900);
      }
      else {
        _local_7e0 = ZEXT416(uVar219);
        auVar130 = vmulps_avx512vl(local_460,auVar130);
        auVar131 = vfmadd213ps_avx512vl(auVar131,local_440,auVar130);
        auVar125 = vfmadd213ps_avx512vl(auVar125,local_420,auVar131);
        auVar125 = vfmadd213ps_avx512vl(auVar124,local_400,auVar125);
        auVar122 = vmulps_avx512vl(local_460,auVar122);
        auVar132 = vfmadd213ps_avx512vl(auVar132,local_440,auVar122);
        auVar131 = vfmadd213ps_avx512vl(auVar134,local_420,auVar132);
        auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1210);
        auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1694);
        auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1b18);
        auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1f9c);
        auVar131 = vfmadd213ps_avx512vl(auVar133,local_400,auVar131);
        auVar133 = vmulps_avx512vl(local_880,auVar124);
        auVar130 = vmulps_avx512vl(local_8a0,auVar124);
        auVar124 = vmulps_avx512vl(local_460,auVar124);
        auVar133 = vfmadd231ps_avx512vl(auVar133,auVar122,local_340);
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar122,local_360);
        auVar122 = vfmadd231ps_avx512vl(auVar124,local_440,auVar122);
        auVar133 = vfmadd231ps_avx512vl(auVar133,auVar132,local_900);
        auVar111 = vfmadd231ps_fma(auVar130,auVar132,local_580);
        auVar124 = vfmadd231ps_avx512vl(auVar122,local_420,auVar132);
        auVar130 = vfmadd231ps_avx512vl(auVar133,auVar134,local_760);
        auVar231 = ZEXT3264(local_780);
        auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar134,local_780);
        auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1210);
        auVar132 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1b18);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1f9c);
        auVar124 = vfmadd231ps_avx512vl(auVar124,local_400,auVar134);
        auVar134 = vmulps_avx512vl(local_880,auVar122);
        auVar128 = vmulps_avx512vl(local_8a0,auVar122);
        auVar122 = vmulps_avx512vl(local_460,auVar122);
        auVar129 = vfmadd231ps_avx512vl(auVar134,auVar132,local_340);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar132,local_360);
        auVar132 = vfmadd231ps_avx512vl(auVar122,local_440,auVar132);
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1694);
        auVar122 = vfmadd231ps_avx512vl(auVar129,auVar134,local_900);
        auVar111 = vfmadd231ps_fma(auVar128,auVar134,local_580);
        auVar134 = vfmadd231ps_avx512vl(auVar132,local_420,auVar134);
        auVar132 = vfmadd231ps_avx512vl(auVar122,auVar133,local_760);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar133,local_780);
        auVar128 = vfmadd231ps_avx512vl(auVar134,local_400,auVar133);
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar133 = vandps_avx(auVar130,auVar228);
        auVar134 = vandps_avx(auVar118,auVar228);
        auVar134 = vmaxps_avx(auVar133,auVar134);
        auVar133 = vandps_avx(auVar124,auVar228);
        auVar133 = vmaxps_avx(auVar134,auVar133);
        auVar124 = vbroadcastss_avx512vl(auVar114);
        uVar100 = vcmpps_avx512vl(auVar133,auVar124,1);
        bVar15 = (bool)((byte)uVar100 & 1);
        auVar135._0_4_ = (float)((uint)bVar15 * local_740._0_4_ | (uint)!bVar15 * auVar130._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar15 * local_740._4_4_ | (uint)!bVar15 * auVar130._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar15 * local_740._8_4_ | (uint)!bVar15 * auVar130._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar15 * local_740._12_4_ | (uint)!bVar15 * auVar130._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar135._16_4_ = (float)((uint)bVar15 * local_740._16_4_ | (uint)!bVar15 * auVar130._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar135._20_4_ = (float)((uint)bVar15 * local_740._20_4_ | (uint)!bVar15 * auVar130._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar135._24_4_ = (float)((uint)bVar15 * local_740._24_4_ | (uint)!bVar15 * auVar130._24_4_)
        ;
        bVar15 = SUB81(uVar100 >> 7,0);
        auVar135._28_4_ = (uint)bVar15 * local_740._28_4_ | (uint)!bVar15 * auVar130._28_4_;
        bVar15 = (bool)((byte)uVar100 & 1);
        auVar136._0_4_ = (float)((uint)bVar15 * local_7a0._0_4_ | (uint)!bVar15 * auVar118._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar136._4_4_ = (float)((uint)bVar15 * local_7a0._4_4_ | (uint)!bVar15 * auVar118._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar136._8_4_ = (float)((uint)bVar15 * local_7a0._8_4_ | (uint)!bVar15 * auVar118._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar136._12_4_ = (float)((uint)bVar15 * local_7a0._12_4_ | (uint)!bVar15 * auVar118._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar136._16_4_ = (float)((uint)bVar15 * local_7a0._16_4_ | (uint)!bVar15 * auVar118._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar136._20_4_ = (float)((uint)bVar15 * local_7a0._20_4_ | (uint)!bVar15 * auVar118._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar136._24_4_ = (float)((uint)bVar15 * local_7a0._24_4_ | (uint)!bVar15 * auVar118._24_4_)
        ;
        bVar15 = SUB81(uVar100 >> 7,0);
        auVar136._28_4_ = (uint)bVar15 * local_7a0._28_4_ | (uint)!bVar15 * auVar118._28_4_;
        auVar133 = vandps_avx(auVar228,auVar132);
        auVar134 = vandps_avx(auVar122,auVar228);
        auVar134 = vmaxps_avx(auVar133,auVar134);
        auVar133 = vandps_avx(auVar128,auVar228);
        auVar133 = vmaxps_avx(auVar134,auVar133);
        uVar100 = vcmpps_avx512vl(auVar133,auVar124,1);
        bVar15 = (bool)((byte)uVar100 & 1);
        auVar137._0_4_ = (float)((uint)bVar15 * local_740._0_4_ | (uint)!bVar15 * auVar132._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar15 * local_740._4_4_ | (uint)!bVar15 * auVar132._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar15 * local_740._8_4_ | (uint)!bVar15 * auVar132._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar15 * local_740._12_4_ | (uint)!bVar15 * auVar132._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar137._16_4_ = (float)((uint)bVar15 * local_740._16_4_ | (uint)!bVar15 * auVar132._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar137._20_4_ = (float)((uint)bVar15 * local_740._20_4_ | (uint)!bVar15 * auVar132._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar137._24_4_ = (float)((uint)bVar15 * local_740._24_4_ | (uint)!bVar15 * auVar132._24_4_)
        ;
        bVar15 = SUB81(uVar100 >> 7,0);
        auVar137._28_4_ = (uint)bVar15 * local_740._28_4_ | (uint)!bVar15 * auVar132._28_4_;
        bVar15 = (bool)((byte)uVar100 & 1);
        auVar138._0_4_ = (float)((uint)bVar15 * local_7a0._0_4_ | (uint)!bVar15 * auVar122._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar15 * local_7a0._4_4_ | (uint)!bVar15 * auVar122._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar15 * local_7a0._8_4_ | (uint)!bVar15 * auVar122._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar15 * local_7a0._12_4_ | (uint)!bVar15 * auVar122._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar15 * local_7a0._16_4_ | (uint)!bVar15 * auVar122._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar15 * local_7a0._20_4_ | (uint)!bVar15 * auVar122._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar15 * local_7a0._24_4_ | (uint)!bVar15 * auVar122._24_4_)
        ;
        bVar15 = SUB81(uVar100 >> 7,0);
        auVar138._28_4_ = (uint)bVar15 * local_7a0._28_4_ | (uint)!bVar15 * auVar122._28_4_;
        auVar117 = vxorps_avx512vl(auVar113,auVar113);
        auVar234 = ZEXT1664(auVar117);
        auVar133 = vfmadd213ps_avx512vl(auVar135,auVar135,ZEXT1632(auVar117));
        auVar113 = vfmadd231ps_fma(auVar133,auVar136,auVar136);
        auVar133 = vrsqrt14ps_avx512vl(ZEXT1632(auVar113));
        fVar201 = auVar133._0_4_;
        fVar169 = auVar133._4_4_;
        fVar206 = auVar133._8_4_;
        fVar207 = auVar133._12_4_;
        fVar190 = auVar133._16_4_;
        fVar200 = auVar133._20_4_;
        fVar109 = auVar133._24_4_;
        auVar43._4_4_ = fVar169 * fVar169 * fVar169 * auVar113._4_4_ * -0.5;
        auVar43._0_4_ = fVar201 * fVar201 * fVar201 * auVar113._0_4_ * -0.5;
        auVar43._8_4_ = fVar206 * fVar206 * fVar206 * auVar113._8_4_ * -0.5;
        auVar43._12_4_ = fVar207 * fVar207 * fVar207 * auVar113._12_4_ * -0.5;
        auVar43._16_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar43._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
        auVar43._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar43._28_4_ = 0;
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar132 = vfmadd231ps_avx512vl(auVar43,auVar134,auVar133);
        auVar44._4_4_ = auVar136._4_4_ * auVar132._4_4_;
        auVar44._0_4_ = auVar136._0_4_ * auVar132._0_4_;
        auVar44._8_4_ = auVar136._8_4_ * auVar132._8_4_;
        auVar44._12_4_ = auVar136._12_4_ * auVar132._12_4_;
        auVar44._16_4_ = auVar136._16_4_ * auVar132._16_4_;
        auVar44._20_4_ = auVar136._20_4_ * auVar132._20_4_;
        auVar44._24_4_ = auVar136._24_4_ * auVar132._24_4_;
        auVar44._28_4_ = auVar133._28_4_;
        auVar45._4_4_ = auVar132._4_4_ * -auVar135._4_4_;
        auVar45._0_4_ = auVar132._0_4_ * -auVar135._0_4_;
        auVar45._8_4_ = auVar132._8_4_ * -auVar135._8_4_;
        auVar45._12_4_ = auVar132._12_4_ * -auVar135._12_4_;
        auVar45._16_4_ = auVar132._16_4_ * -auVar135._16_4_;
        auVar45._20_4_ = auVar132._20_4_ * -auVar135._20_4_;
        auVar45._24_4_ = auVar132._24_4_ * -auVar135._24_4_;
        auVar45._28_4_ = auVar135._28_4_ ^ 0x80000000;
        auVar133 = vmulps_avx512vl(auVar132,ZEXT1632(auVar117));
        auVar118 = ZEXT1632(auVar117);
        auVar122 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar118);
        auVar113 = vfmadd231ps_fma(auVar122,auVar138,auVar138);
        auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar113));
        fVar201 = auVar122._0_4_;
        fVar169 = auVar122._4_4_;
        fVar206 = auVar122._8_4_;
        fVar207 = auVar122._12_4_;
        fVar190 = auVar122._16_4_;
        fVar200 = auVar122._20_4_;
        fVar109 = auVar122._24_4_;
        auVar46._4_4_ = fVar169 * fVar169 * fVar169 * auVar113._4_4_ * -0.5;
        auVar46._0_4_ = fVar201 * fVar201 * fVar201 * auVar113._0_4_ * -0.5;
        auVar46._8_4_ = fVar206 * fVar206 * fVar206 * auVar113._8_4_ * -0.5;
        auVar46._12_4_ = fVar207 * fVar207 * fVar207 * auVar113._12_4_ * -0.5;
        auVar46._16_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar46._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
        auVar46._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar46._28_4_ = 0;
        auVar134 = vfmadd231ps_avx512vl(auVar46,auVar134,auVar122);
        auVar47._4_4_ = auVar138._4_4_ * auVar134._4_4_;
        auVar47._0_4_ = auVar138._0_4_ * auVar134._0_4_;
        auVar47._8_4_ = auVar138._8_4_ * auVar134._8_4_;
        auVar47._12_4_ = auVar138._12_4_ * auVar134._12_4_;
        auVar47._16_4_ = auVar138._16_4_ * auVar134._16_4_;
        auVar47._20_4_ = auVar138._20_4_ * auVar134._20_4_;
        auVar47._24_4_ = auVar138._24_4_ * auVar134._24_4_;
        auVar47._28_4_ = auVar122._28_4_;
        auVar48._4_4_ = -auVar137._4_4_ * auVar134._4_4_;
        auVar48._0_4_ = -auVar137._0_4_ * auVar134._0_4_;
        auVar48._8_4_ = -auVar137._8_4_ * auVar134._8_4_;
        auVar48._12_4_ = -auVar137._12_4_ * auVar134._12_4_;
        auVar48._16_4_ = -auVar137._16_4_ * auVar134._16_4_;
        auVar48._20_4_ = -auVar137._20_4_ * auVar134._20_4_;
        auVar48._24_4_ = -auVar137._24_4_ * auVar134._24_4_;
        auVar48._28_4_ = auVar132._28_4_;
        auVar134 = vmulps_avx512vl(auVar134,auVar118);
        auVar113 = vfmadd213ps_fma(auVar44,auVar119,auVar120);
        auVar111 = vfmadd213ps_fma(auVar45,auVar119,auVar126);
        auVar132 = vfmadd213ps_avx512vl(auVar133,auVar119,auVar131);
        auVar122 = vfmadd213ps_avx512vl(auVar47,ZEXT1632(auVar112),ZEXT1632(auVar8));
        auVar115 = vfnmadd213ps_fma(auVar44,auVar119,auVar120);
        auVar130 = ZEXT1632(auVar112);
        auVar233 = vfmadd213ps_fma(auVar48,auVar130,auVar127);
        auVar116 = vfnmadd213ps_fma(auVar45,auVar119,auVar126);
        auVar6 = vfmadd213ps_fma(auVar134,auVar130,auVar125);
        auVar124 = vfnmadd231ps_avx512vl(auVar131,auVar119,auVar133);
        auVar191 = vfnmadd213ps_fma(auVar47,auVar130,ZEXT1632(auVar8));
        auVar192 = vfnmadd213ps_fma(auVar48,auVar130,auVar127);
        auVar220 = vfnmadd231ps_fma(auVar125,ZEXT1632(auVar112),auVar134);
        auVar134 = vsubps_avx512vl(auVar122,ZEXT1632(auVar115));
        auVar133 = vsubps_avx(ZEXT1632(auVar233),ZEXT1632(auVar116));
        auVar125 = vsubps_avx512vl(ZEXT1632(auVar6),auVar124);
        auVar131 = vmulps_avx512vl(auVar133,auVar124);
        auVar7 = vfmsub231ps_fma(auVar131,ZEXT1632(auVar116),auVar125);
        auVar49._4_4_ = auVar115._4_4_ * auVar125._4_4_;
        auVar49._0_4_ = auVar115._0_4_ * auVar125._0_4_;
        auVar49._8_4_ = auVar115._8_4_ * auVar125._8_4_;
        auVar49._12_4_ = auVar115._12_4_ * auVar125._12_4_;
        auVar49._16_4_ = auVar125._16_4_ * 0.0;
        auVar49._20_4_ = auVar125._20_4_ * 0.0;
        auVar49._24_4_ = auVar125._24_4_ * 0.0;
        auVar49._28_4_ = auVar125._28_4_;
        auVar125 = vfmsub231ps_avx512vl(auVar49,auVar124,auVar134);
        auVar50._4_4_ = auVar116._4_4_ * auVar134._4_4_;
        auVar50._0_4_ = auVar116._0_4_ * auVar134._0_4_;
        auVar50._8_4_ = auVar116._8_4_ * auVar134._8_4_;
        auVar50._12_4_ = auVar116._12_4_ * auVar134._12_4_;
        auVar50._16_4_ = auVar134._16_4_ * 0.0;
        auVar50._20_4_ = auVar134._20_4_ * 0.0;
        auVar50._24_4_ = auVar134._24_4_ * 0.0;
        auVar50._28_4_ = auVar134._28_4_;
        auVar8 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar115),auVar133);
        auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar118,auVar125);
        auVar133 = vfmadd231ps_avx512vl(auVar133,auVar118,ZEXT1632(auVar7));
        auVar118 = ZEXT1632(auVar117);
        uVar100 = vcmpps_avx512vl(auVar133,auVar118,2);
        bVar99 = (byte)uVar100;
        fVar109 = (float)((uint)(bVar99 & 1) * auVar113._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar191._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        fVar189 = (float)((uint)bVar15 * auVar113._4_4_ | (uint)!bVar15 * auVar191._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        fVar162 = (float)((uint)bVar15 * auVar113._8_4_ | (uint)!bVar15 * auVar191._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        fVar165 = (float)((uint)bVar15 * auVar113._12_4_ | (uint)!bVar15 * auVar191._12_4_);
        auVar131 = ZEXT1632(CONCAT412(fVar165,CONCAT48(fVar162,CONCAT44(fVar189,fVar109))));
        fVar110 = (float)((uint)(bVar99 & 1) * auVar111._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar192._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        fVar161 = (float)((uint)bVar15 * auVar111._4_4_ | (uint)!bVar15 * auVar192._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        fVar163 = (float)((uint)bVar15 * auVar111._8_4_ | (uint)!bVar15 * auVar192._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        fVar166 = (float)((uint)bVar15 * auVar111._12_4_ | (uint)!bVar15 * auVar192._12_4_);
        auVar130 = ZEXT1632(CONCAT412(fVar166,CONCAT48(fVar163,CONCAT44(fVar161,fVar110))));
        auVar139._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar132._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar220._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar15 * auVar132._4_4_ | (uint)!bVar15 * auVar220._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar15 * auVar132._8_4_ | (uint)!bVar15 * auVar220._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar15 * auVar132._12_4_ | (uint)!bVar15 * auVar220._12_4_);
        fVar201 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar132._16_4_);
        auVar139._16_4_ = fVar201;
        fVar206 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar132._20_4_);
        auVar139._20_4_ = fVar206;
        fVar169 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar132._24_4_);
        auVar139._24_4_ = fVar169;
        iVar1 = (uint)(byte)(uVar100 >> 7) * auVar132._28_4_;
        auVar139._28_4_ = iVar1;
        auVar134 = vblendmps_avx512vl(ZEXT1632(auVar115),auVar122);
        auVar140._0_4_ =
             (uint)(bVar99 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar7._0_4_;
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar15 * auVar134._4_4_ | (uint)!bVar15 * auVar7._4_4_;
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar15 * auVar134._8_4_ | (uint)!bVar15 * auVar7._8_4_;
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar15 * auVar134._12_4_ | (uint)!bVar15 * auVar7._12_4_;
        auVar140._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar134._16_4_;
        auVar140._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar134._20_4_;
        auVar140._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar134._24_4_;
        auVar140._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar134._28_4_;
        auVar134 = vblendmps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar233));
        auVar141._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar134._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar111._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar141._4_4_ = (float)((uint)bVar15 * auVar134._4_4_ | (uint)!bVar15 * auVar111._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar141._8_4_ = (float)((uint)bVar15 * auVar134._8_4_ | (uint)!bVar15 * auVar111._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar141._12_4_ = (float)((uint)bVar15 * auVar134._12_4_ | (uint)!bVar15 * auVar111._12_4_);
        fVar200 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar134._16_4_);
        auVar141._16_4_ = fVar200;
        fVar190 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar134._20_4_);
        auVar141._20_4_ = fVar190;
        fVar207 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar134._24_4_);
        auVar141._24_4_ = fVar207;
        auVar141._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar134._28_4_;
        auVar134 = vblendmps_avx512vl(auVar124,ZEXT1632(auVar6));
        auVar142._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar134._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar132._0_4_);
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar142._4_4_ = (float)((uint)bVar15 * auVar134._4_4_ | (uint)!bVar15 * auVar132._4_4_);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar142._8_4_ = (float)((uint)bVar15 * auVar134._8_4_ | (uint)!bVar15 * auVar132._8_4_);
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar142._12_4_ = (float)((uint)bVar15 * auVar134._12_4_ | (uint)!bVar15 * auVar132._12_4_);
        bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar142._16_4_ = (float)((uint)bVar15 * auVar134._16_4_ | (uint)!bVar15 * auVar132._16_4_);
        bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar142._20_4_ = (float)((uint)bVar15 * auVar134._20_4_ | (uint)!bVar15 * auVar132._20_4_);
        bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar142._24_4_ = (float)((uint)bVar15 * auVar134._24_4_ | (uint)!bVar15 * auVar132._24_4_);
        bVar15 = SUB81(uVar100 >> 7,0);
        auVar142._28_4_ = (uint)bVar15 * auVar134._28_4_ | (uint)!bVar15 * auVar132._28_4_;
        auVar143._0_4_ =
             (uint)(bVar99 & 1) * (int)auVar115._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar122._0_4_;
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar15 * (int)auVar115._4_4_ | (uint)!bVar15 * auVar122._4_4_;
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar15 * (int)auVar115._8_4_ | (uint)!bVar15 * auVar122._8_4_;
        bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar15 * (int)auVar115._12_4_ | (uint)!bVar15 * auVar122._12_4_;
        auVar143._16_4_ = (uint)!(bool)((byte)(uVar100 >> 4) & 1) * auVar122._16_4_;
        auVar143._20_4_ = (uint)!(bool)((byte)(uVar100 >> 5) & 1) * auVar122._20_4_;
        auVar143._24_4_ = (uint)!(bool)((byte)(uVar100 >> 6) & 1) * auVar122._24_4_;
        auVar143._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar122._28_4_;
        bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar100 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar144._0_4_ =
             (uint)(bVar99 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar6._0_4_;
        bVar16 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar16 * auVar124._4_4_ | (uint)!bVar16 * auVar6._4_4_;
        bVar16 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar16 * auVar124._8_4_ | (uint)!bVar16 * auVar6._8_4_;
        bVar16 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar16 * auVar124._12_4_ | (uint)!bVar16 * auVar6._12_4_;
        auVar144._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar124._16_4_;
        auVar144._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar124._20_4_;
        auVar144._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar124._24_4_;
        iVar2 = (uint)(byte)(uVar100 >> 7) * auVar124._28_4_;
        auVar144._28_4_ = iVar2;
        auVar120 = vsubps_avx512vl(auVar143,auVar131);
        auVar134 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar116._12_4_ |
                                                 (uint)!bVar18 * auVar233._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar116._8_4_ |
                                                          (uint)!bVar17 * auVar233._8_4_,
                                                          CONCAT44((uint)bVar15 *
                                                                   (int)auVar116._4_4_ |
                                                                   (uint)!bVar15 * auVar233._4_4_,
                                                                   (uint)(bVar99 & 1) *
                                                                   (int)auVar116._0_4_ |
                                                                   (uint)!(bool)(bVar99 & 1) *
                                                                   auVar233._0_4_)))),auVar130);
        auVar132 = vsubps_avx(auVar144,auVar139);
        auVar122 = vsubps_avx(auVar131,auVar140);
        auVar124 = vsubps_avx(auVar130,auVar141);
        auVar125 = vsubps_avx(auVar139,auVar142);
        auVar51._4_4_ = auVar132._4_4_ * fVar189;
        auVar51._0_4_ = auVar132._0_4_ * fVar109;
        auVar51._8_4_ = auVar132._8_4_ * fVar162;
        auVar51._12_4_ = auVar132._12_4_ * fVar165;
        auVar51._16_4_ = auVar132._16_4_ * 0.0;
        auVar51._20_4_ = auVar132._20_4_ * 0.0;
        auVar51._24_4_ = auVar132._24_4_ * 0.0;
        auVar51._28_4_ = iVar2;
        auVar113 = vfmsub231ps_fma(auVar51,auVar139,auVar120);
        auVar52._4_4_ = fVar161 * auVar120._4_4_;
        auVar52._0_4_ = fVar110 * auVar120._0_4_;
        auVar52._8_4_ = fVar163 * auVar120._8_4_;
        auVar52._12_4_ = fVar166 * auVar120._12_4_;
        auVar52._16_4_ = auVar120._16_4_ * 0.0;
        auVar52._20_4_ = auVar120._20_4_ * 0.0;
        auVar52._24_4_ = auVar120._24_4_ * 0.0;
        auVar52._28_4_ = auVar133._28_4_;
        auVar111 = vfmsub231ps_fma(auVar52,auVar131,auVar134);
        auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar118,ZEXT1632(auVar113));
        auVar202._0_4_ = auVar134._0_4_ * auVar139._0_4_;
        auVar202._4_4_ = auVar134._4_4_ * auVar139._4_4_;
        auVar202._8_4_ = auVar134._8_4_ * auVar139._8_4_;
        auVar202._12_4_ = auVar134._12_4_ * auVar139._12_4_;
        auVar202._16_4_ = auVar134._16_4_ * fVar201;
        auVar202._20_4_ = auVar134._20_4_ * fVar206;
        auVar202._24_4_ = auVar134._24_4_ * fVar169;
        auVar202._28_4_ = 0;
        auVar113 = vfmsub231ps_fma(auVar202,auVar130,auVar132);
        auVar126 = vfmadd231ps_avx512vl(auVar133,auVar118,ZEXT1632(auVar113));
        auVar133 = vmulps_avx512vl(auVar125,auVar140);
        auVar133 = vfmsub231ps_avx512vl(auVar133,auVar122,auVar142);
        auVar53._4_4_ = auVar124._4_4_ * auVar142._4_4_;
        auVar53._0_4_ = auVar124._0_4_ * auVar142._0_4_;
        auVar53._8_4_ = auVar124._8_4_ * auVar142._8_4_;
        auVar53._12_4_ = auVar124._12_4_ * auVar142._12_4_;
        auVar53._16_4_ = auVar124._16_4_ * auVar142._16_4_;
        auVar53._20_4_ = auVar124._20_4_ * auVar142._20_4_;
        auVar53._24_4_ = auVar124._24_4_ * auVar142._24_4_;
        auVar53._28_4_ = auVar142._28_4_;
        auVar113 = vfmsub231ps_fma(auVar53,auVar141,auVar125);
        auVar203._0_4_ = auVar141._0_4_ * auVar122._0_4_;
        auVar203._4_4_ = auVar141._4_4_ * auVar122._4_4_;
        auVar203._8_4_ = auVar141._8_4_ * auVar122._8_4_;
        auVar203._12_4_ = auVar141._12_4_ * auVar122._12_4_;
        auVar203._16_4_ = fVar200 * auVar122._16_4_;
        auVar203._20_4_ = fVar190 * auVar122._20_4_;
        auVar203._24_4_ = fVar207 * auVar122._24_4_;
        auVar203._28_4_ = 0;
        auVar111 = vfmsub231ps_fma(auVar203,auVar124,auVar140);
        auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar118,auVar133);
        auVar127 = vfmadd231ps_avx512vl(auVar133,auVar118,ZEXT1632(auVar113));
        auVar133 = vmaxps_avx(auVar126,auVar127);
        uVar171 = vcmpps_avx512vl(auVar133,auVar118,2);
        bVar108 = bVar108 & (byte)uVar171;
        in_ZMM20 = ZEXT3264(local_840);
        in_ZMM21 = ZEXT3264(local_860);
        auVar232 = ZEXT3264(local_760);
        auVar230 = ZEXT3264(local_900);
        if (bVar108 == 0) {
          bVar108 = 0;
          auVar216 = ZEXT3264(auVar121);
          auVar199 = ZEXT3264(auVar123);
        }
        else {
          auVar54._4_4_ = auVar125._4_4_ * auVar134._4_4_;
          auVar54._0_4_ = auVar125._0_4_ * auVar134._0_4_;
          auVar54._8_4_ = auVar125._8_4_ * auVar134._8_4_;
          auVar54._12_4_ = auVar125._12_4_ * auVar134._12_4_;
          auVar54._16_4_ = auVar125._16_4_ * auVar134._16_4_;
          auVar54._20_4_ = auVar125._20_4_ * auVar134._20_4_;
          auVar54._24_4_ = auVar125._24_4_ * auVar134._24_4_;
          auVar54._28_4_ = auVar133._28_4_;
          auVar233 = vfmsub231ps_fma(auVar54,auVar124,auVar132);
          auVar55._4_4_ = auVar132._4_4_ * auVar122._4_4_;
          auVar55._0_4_ = auVar132._0_4_ * auVar122._0_4_;
          auVar55._8_4_ = auVar132._8_4_ * auVar122._8_4_;
          auVar55._12_4_ = auVar132._12_4_ * auVar122._12_4_;
          auVar55._16_4_ = auVar132._16_4_ * auVar122._16_4_;
          auVar55._20_4_ = auVar132._20_4_ * auVar122._20_4_;
          auVar55._24_4_ = auVar132._24_4_ * auVar122._24_4_;
          auVar55._28_4_ = auVar132._28_4_;
          auVar111 = vfmsub231ps_fma(auVar55,auVar120,auVar125);
          auVar56._4_4_ = auVar124._4_4_ * auVar120._4_4_;
          auVar56._0_4_ = auVar124._0_4_ * auVar120._0_4_;
          auVar56._8_4_ = auVar124._8_4_ * auVar120._8_4_;
          auVar56._12_4_ = auVar124._12_4_ * auVar120._12_4_;
          auVar56._16_4_ = auVar124._16_4_ * auVar120._16_4_;
          auVar56._20_4_ = auVar124._20_4_ * auVar120._20_4_;
          auVar56._24_4_ = auVar124._24_4_ * auVar120._24_4_;
          auVar56._28_4_ = auVar124._28_4_;
          auVar6 = vfmsub231ps_fma(auVar56,auVar122,auVar134);
          auVar113 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar111),ZEXT1632(auVar6));
          auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),ZEXT1632(auVar233),auVar118);
          auVar134 = vrcp14ps_avx512vl(auVar133);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = &DAT_3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar132 = vfnmadd213ps_avx512vl(auVar134,auVar133,auVar32);
          auVar113 = vfmadd132ps_fma(auVar132,auVar134,auVar134);
          auVar57._4_4_ = auVar6._4_4_ * auVar139._4_4_;
          auVar57._0_4_ = auVar6._0_4_ * auVar139._0_4_;
          auVar57._8_4_ = auVar6._8_4_ * auVar139._8_4_;
          auVar57._12_4_ = auVar6._12_4_ * auVar139._12_4_;
          auVar57._16_4_ = fVar201 * 0.0;
          auVar57._20_4_ = fVar206 * 0.0;
          auVar57._24_4_ = fVar169 * 0.0;
          auVar57._28_4_ = iVar1;
          auVar111 = vfmadd231ps_fma(auVar57,auVar130,ZEXT1632(auVar111));
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar131,ZEXT1632(auVar233));
          fVar201 = auVar113._0_4_;
          fVar169 = auVar113._4_4_;
          fVar206 = auVar113._8_4_;
          fVar207 = auVar113._12_4_;
          auVar134 = ZEXT1632(CONCAT412(auVar111._12_4_ * fVar207,
                                        CONCAT48(auVar111._8_4_ * fVar206,
                                                 CONCAT44(auVar111._4_4_ * fVar169,
                                                          auVar111._0_4_ * fVar201))));
          auVar218._4_4_ = uVar219;
          auVar218._0_4_ = uVar219;
          auVar218._8_4_ = uVar219;
          auVar218._12_4_ = uVar219;
          auVar218._16_4_ = uVar219;
          auVar218._20_4_ = uVar219;
          auVar218._24_4_ = uVar219;
          auVar218._28_4_ = uVar219;
          uVar171 = vcmpps_avx512vl(auVar218,auVar134,2);
          uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar33._4_4_ = uVar170;
          auVar33._0_4_ = uVar170;
          auVar33._8_4_ = uVar170;
          auVar33._12_4_ = uVar170;
          auVar33._16_4_ = uVar170;
          auVar33._20_4_ = uVar170;
          auVar33._24_4_ = uVar170;
          auVar33._28_4_ = uVar170;
          uVar30 = vcmpps_avx512vl(auVar134,auVar33,2);
          bVar108 = (byte)uVar171 & (byte)uVar30 & bVar108;
          if (bVar108 == 0) {
            bVar108 = 0;
            auVar216 = ZEXT3264(auVar121);
            auVar199 = ZEXT3264(auVar123);
          }
          else {
            uVar171 = vcmpps_avx512vl(auVar133,auVar118,4);
            if ((bVar108 & (byte)uVar171) == 0) {
              bVar108 = 0;
              auVar216 = ZEXT3264(auVar121);
              auVar199 = ZEXT3264(auVar123);
            }
            else {
              bVar108 = bVar108 & (byte)uVar171;
              fVar190 = auVar126._0_4_ * fVar201;
              fVar200 = auVar126._4_4_ * fVar169;
              auVar58._4_4_ = fVar200;
              auVar58._0_4_ = fVar190;
              fVar109 = auVar126._8_4_ * fVar206;
              auVar58._8_4_ = fVar109;
              fVar110 = auVar126._12_4_ * fVar207;
              auVar58._12_4_ = fVar110;
              fVar189 = auVar126._16_4_ * 0.0;
              auVar58._16_4_ = fVar189;
              fVar161 = auVar126._20_4_ * 0.0;
              auVar58._20_4_ = fVar161;
              fVar162 = auVar126._24_4_ * 0.0;
              auVar58._24_4_ = fVar162;
              auVar58._28_4_ = auVar126._28_4_;
              fVar201 = auVar127._0_4_ * fVar201;
              fVar169 = auVar127._4_4_ * fVar169;
              auVar59._4_4_ = fVar169;
              auVar59._0_4_ = fVar201;
              fVar206 = auVar127._8_4_ * fVar206;
              auVar59._8_4_ = fVar206;
              fVar207 = auVar127._12_4_ * fVar207;
              auVar59._12_4_ = fVar207;
              fVar163 = auVar127._16_4_ * 0.0;
              auVar59._16_4_ = fVar163;
              fVar165 = auVar127._20_4_ * 0.0;
              auVar59._20_4_ = fVar165;
              fVar166 = auVar127._24_4_ * 0.0;
              auVar59._24_4_ = fVar166;
              auVar59._28_4_ = auVar127._28_4_;
              auVar212._8_4_ = 0x3f800000;
              auVar212._0_8_ = &DAT_3f8000003f800000;
              auVar212._12_4_ = 0x3f800000;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar123 = vsubps_avx(auVar212,auVar58);
              bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar100 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar100 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar100 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar100 >> 6) & 1);
              bVar21 = SUB81(uVar100 >> 7,0);
              auVar216 = ZEXT3264(CONCAT428((uint)bVar21 * auVar126._28_4_ |
                                            (uint)!bVar21 * auVar123._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar162 |
                                                      (uint)!bVar20 * auVar123._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar161 |
                                                                (uint)!bVar19 * auVar123._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar189 |
                                                                          (uint)!bVar18 *
                                                                          auVar123._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar110 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar123._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar109 |
                                                  (uint)!bVar16 * auVar123._8_4_,
                                                  CONCAT44((uint)bVar15 * (int)fVar200 |
                                                           (uint)!bVar15 * auVar123._4_4_,
                                                           (uint)(bVar99 & 1) * (int)fVar190 |
                                                           (uint)!(bool)(bVar99 & 1) *
                                                           auVar123._0_4_))))))));
              auVar123 = vsubps_avx(auVar212,auVar59);
              local_5a0._0_4_ =
                   (uint)(bVar99 & 1) * (int)fVar201 | (uint)!(bool)(bVar99 & 1) * auVar123._0_4_;
              bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
              local_5a0._4_4_ = (uint)bVar15 * (int)fVar169 | (uint)!bVar15 * auVar123._4_4_;
              bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
              local_5a0._8_4_ = (uint)bVar15 * (int)fVar206 | (uint)!bVar15 * auVar123._8_4_;
              bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
              local_5a0._12_4_ = (uint)bVar15 * (int)fVar207 | (uint)!bVar15 * auVar123._12_4_;
              bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
              local_5a0._16_4_ = (uint)bVar15 * (int)fVar163 | (uint)!bVar15 * auVar123._16_4_;
              bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
              local_5a0._20_4_ = (uint)bVar15 * (int)fVar165 | (uint)!bVar15 * auVar123._20_4_;
              bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
              local_5a0._24_4_ = (uint)bVar15 * (int)fVar166 | (uint)!bVar15 * auVar123._24_4_;
              bVar15 = SUB81(uVar100 >> 7,0);
              local_5a0._28_4_ = (uint)bVar15 * auVar127._28_4_ | (uint)!bVar15 * auVar123._28_4_;
              auVar199 = ZEXT3264(auVar134);
            }
          }
        }
        auVar235 = ZEXT3264(local_8a0);
        auVar183 = ZEXT3264(local_880);
        if (bVar108 != 0) {
          auVar123 = vsubps_avx(ZEXT1632(auVar112),auVar119);
          auVar133 = auVar216._0_32_;
          auVar113 = vfmadd213ps_fma(auVar123,auVar133,auVar119);
          uVar170 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar34._4_4_ = uVar170;
          auVar34._0_4_ = uVar170;
          auVar34._8_4_ = uVar170;
          auVar34._12_4_ = uVar170;
          auVar34._16_4_ = uVar170;
          auVar34._20_4_ = uVar170;
          auVar34._24_4_ = uVar170;
          auVar34._28_4_ = uVar170;
          auVar123 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar113._12_4_ + auVar113._12_4_,
                                                        CONCAT48(auVar113._8_4_ + auVar113._8_4_,
                                                                 CONCAT44(auVar113._4_4_ +
                                                                          auVar113._4_4_,
                                                                          auVar113._0_4_ +
                                                                          auVar113._0_4_)))),auVar34
                                    );
          auVar121 = auVar199._0_32_;
          uVar171 = vcmpps_avx512vl(auVar121,auVar123,6);
          bVar108 = bVar108 & (byte)uVar171;
          if (bVar108 != 0) {
            auVar176._8_4_ = 0xbf800000;
            auVar176._0_8_ = 0xbf800000bf800000;
            auVar176._12_4_ = 0xbf800000;
            auVar176._16_4_ = 0xbf800000;
            auVar176._20_4_ = 0xbf800000;
            auVar176._24_4_ = 0xbf800000;
            auVar176._28_4_ = 0xbf800000;
            auVar35._8_4_ = 0x40000000;
            auVar35._0_8_ = 0x4000000040000000;
            auVar35._12_4_ = 0x40000000;
            auVar35._16_4_ = 0x40000000;
            auVar35._20_4_ = 0x40000000;
            auVar35._24_4_ = 0x40000000;
            auVar35._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_5a0,auVar176,auVar35);
            local_5a0 = local_700;
            auVar123 = local_5a0;
            local_6c0 = 0;
            local_6a0 = local_8b0._0_8_;
            uStack_698 = local_8b0._8_8_;
            local_690 = local_8c0._0_8_;
            uStack_688 = local_8c0._8_8_;
            local_680 = local_8d0;
            uStack_678 = uStack_8c8;
            local_5a0 = auVar123;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar201 = 1.0 / auVar224._0_4_;
              local_660[0] = fVar201 * (auVar216._0_4_ + 0.0);
              local_660[1] = fVar201 * (auVar216._4_4_ + 1.0);
              local_660[2] = fVar201 * (auVar216._8_4_ + 2.0);
              local_660[3] = fVar201 * (auVar216._12_4_ + 3.0);
              fStack_650 = fVar201 * (auVar216._16_4_ + 4.0);
              fStack_64c = fVar201 * (auVar216._20_4_ + 5.0);
              fStack_648 = fVar201 * (auVar216._24_4_ + 6.0);
              fStack_644 = auVar216._28_4_ + 7.0;
              local_5a0._0_8_ = local_700._0_8_;
              local_5a0._8_8_ = local_700._8_8_;
              local_5a0._16_8_ = local_700._16_8_;
              local_5a0._24_8_ = local_700._24_8_;
              local_640 = local_5a0._0_8_;
              uStack_638 = local_5a0._8_8_;
              uStack_630 = local_5a0._16_8_;
              uStack_628 = local_5a0._24_8_;
              local_620 = auVar121;
              auVar177._8_4_ = 0x7f800000;
              auVar177._0_8_ = 0x7f8000007f800000;
              auVar177._12_4_ = 0x7f800000;
              auVar177._16_4_ = 0x7f800000;
              auVar177._20_4_ = 0x7f800000;
              auVar177._24_4_ = 0x7f800000;
              auVar177._28_4_ = 0x7f800000;
              auVar123 = vblendmps_avx512vl(auVar177,auVar121);
              auVar145._0_4_ =
                   (uint)(bVar108 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar108 & 1) * 0x7f800000;
              bVar15 = (bool)(bVar108 >> 1 & 1);
              auVar145._4_4_ = (uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar108 >> 2 & 1);
              auVar145._8_4_ = (uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar108 >> 3 & 1);
              auVar145._12_4_ = (uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar108 >> 4 & 1);
              auVar145._16_4_ = (uint)bVar15 * auVar123._16_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar108 >> 5 & 1);
              auVar145._20_4_ = (uint)bVar15 * auVar123._20_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar108 >> 6 & 1);
              auVar145._24_4_ = (uint)bVar15 * auVar123._24_4_ | (uint)!bVar15 * 0x7f800000;
              auVar145._28_4_ =
                   (uint)(bVar108 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar108 >> 7) * 0x7f800000
              ;
              auVar123 = vshufps_avx(auVar145,auVar145,0xb1);
              auVar123 = vminps_avx(auVar145,auVar123);
              auVar134 = vshufpd_avx(auVar123,auVar123,5);
              auVar123 = vminps_avx(auVar123,auVar134);
              auVar134 = vpermpd_avx2(auVar123,0x4e);
              auVar123 = vminps_avx(auVar123,auVar134);
              uVar171 = vcmpps_avx512vl(auVar145,auVar123,0);
              bVar98 = (byte)uVar171 & bVar108;
              bVar99 = bVar108;
              if (bVar98 != 0) {
                bVar99 = bVar98;
              }
              uVar102 = 0;
              for (uVar101 = (uint)bVar99; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000)
              {
                uVar102 = uVar102 + 1;
              }
              uVar100 = (ulong)uVar102;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar201 = local_660[uVar100];
                uVar170 = *(undefined4 *)((long)&local_640 + uVar100 * 4);
                fVar206 = 1.0 - fVar201;
                fVar169 = fVar206 * fVar206 * -3.0;
                auVar113 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),
                                           ZEXT416((uint)(fVar201 * fVar206)),ZEXT416(0xc0000000));
                auVar111 = vfmsub132ss_fma(ZEXT416((uint)(fVar201 * fVar206)),
                                           ZEXT416((uint)(fVar201 * fVar201)),ZEXT416(0x40000000));
                fVar206 = auVar113._0_4_ * 3.0;
                fVar207 = auVar111._0_4_ * 3.0;
                fVar190 = fVar201 * fVar201 * 3.0;
                auVar208._0_4_ = fVar190 * (float)local_8d0._0_4_;
                auVar208._4_4_ = fVar190 * (float)local_8d0._4_4_;
                auVar208._8_4_ = fVar190 * (float)uStack_8c8;
                auVar208._12_4_ = fVar190 * uStack_8c8._4_4_;
                auVar185._4_4_ = fVar207;
                auVar185._0_4_ = fVar207;
                auVar185._8_4_ = fVar207;
                auVar185._12_4_ = fVar207;
                auVar113 = vfmadd132ps_fma(auVar185,auVar208,local_8c0);
                auVar216 = ZEXT3264(auVar133);
                auVar193._4_4_ = fVar206;
                auVar193._0_4_ = fVar206;
                auVar193._8_4_ = fVar206;
                auVar193._12_4_ = fVar206;
                auVar113 = vfmadd132ps_fma(auVar193,auVar113,local_8b0);
                auVar186._4_4_ = fVar169;
                auVar186._0_4_ = fVar169;
                auVar186._8_4_ = fVar169;
                auVar186._12_4_ = fVar169;
                auVar113 = vfmadd213ps_fma(auVar186,auVar29,auVar113);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar100 * 4);
                auVar199 = ZEXT3264(auVar121);
                *(int *)(ray + k * 4 + 0x300) = auVar113._0_4_;
                uVar11 = vextractps_avx(auVar113,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar11;
                uVar11 = vextractps_avx(auVar113,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar11;
                *(float *)(ray + k * 4 + 0x3c0) = fVar201;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar170;
                *(undefined4 *)(ray + k * 4 + 0x440) = uVar3;
                *(uint *)(ray + k * 4 + 0x480) = uVar106;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar199 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar199);
                auVar199 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar199);
                local_7f0 = local_8b0._0_4_;
                uStack_7ec = local_8b0._4_4_;
                uStack_7e8 = local_8b0._8_8_;
                local_800 = local_8c0._0_8_;
                uStack_7f8 = local_8c0._8_8_;
                local_810 = (float)local_8d0._0_4_;
                fStack_80c = (float)local_8d0._4_4_;
                fStack_808 = (float)uStack_8c8;
                fStack_804 = uStack_8c8._4_4_;
                local_720 = auVar133;
                local_6e0 = auVar121;
                local_6bc = iVar10;
                local_6b0 = auVar29;
                local_670 = bVar108;
                do {
                  auVar233 = auVar234._0_16_;
                  local_740._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar100]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_640 + uVar100 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar100 * 4);
                  local_940.context = context->user;
                  fVar207 = local_200._0_4_;
                  fVar169 = 1.0 - fVar207;
                  fVar201 = fVar169 * fVar169 * -3.0;
                  auVar113 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169)),
                                             ZEXT416((uint)(fVar207 * fVar169)),ZEXT416(0xc0000000))
                  ;
                  auVar111 = vfmsub132ss_fma(ZEXT416((uint)(fVar207 * fVar169)),
                                             ZEXT416((uint)(fVar207 * fVar207)),ZEXT416(0x40000000))
                  ;
                  fVar169 = auVar113._0_4_ * 3.0;
                  fVar206 = auVar111._0_4_ * 3.0;
                  fVar207 = fVar207 * fVar207 * 3.0;
                  auVar211._0_4_ = fVar207 * local_810;
                  auVar211._4_4_ = fVar207 * fStack_80c;
                  auVar211._8_4_ = fVar207 * fStack_808;
                  auVar211._12_4_ = fVar207 * fStack_804;
                  auVar174._4_4_ = fVar206;
                  auVar174._0_4_ = fVar206;
                  auVar174._8_4_ = fVar206;
                  auVar174._12_4_ = fVar206;
                  auVar95._8_8_ = uStack_7f8;
                  auVar95._0_8_ = local_800;
                  auVar113 = vfmadd132ps_fma(auVar174,auVar211,auVar95);
                  auVar196._4_4_ = fVar169;
                  auVar196._0_4_ = fVar169;
                  auVar196._8_4_ = fVar169;
                  auVar196._12_4_ = fVar169;
                  auVar96._4_4_ = uStack_7ec;
                  auVar96._0_4_ = local_7f0;
                  auVar96._8_8_ = uStack_7e8;
                  auVar113 = vfmadd132ps_fma(auVar196,auVar113,auVar96);
                  auVar175._4_4_ = fVar201;
                  auVar175._0_4_ = fVar201;
                  auVar175._8_4_ = fVar201;
                  auVar175._12_4_ = fVar201;
                  auVar113 = vfmadd213ps_fma(auVar175,auVar29,auVar113);
                  auVar199 = vbroadcastss_avx512f(auVar113);
                  auVar216 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar216,ZEXT1664(auVar113));
                  auVar216 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar216,ZEXT1664(auVar113));
                  local_2c0[0] = (RTCHitN)auVar199[0];
                  local_2c0[1] = (RTCHitN)auVar199[1];
                  local_2c0[2] = (RTCHitN)auVar199[2];
                  local_2c0[3] = (RTCHitN)auVar199[3];
                  local_2c0[4] = (RTCHitN)auVar199[4];
                  local_2c0[5] = (RTCHitN)auVar199[5];
                  local_2c0[6] = (RTCHitN)auVar199[6];
                  local_2c0[7] = (RTCHitN)auVar199[7];
                  local_2c0[8] = (RTCHitN)auVar199[8];
                  local_2c0[9] = (RTCHitN)auVar199[9];
                  local_2c0[10] = (RTCHitN)auVar199[10];
                  local_2c0[0xb] = (RTCHitN)auVar199[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar199[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar199[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar199[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar199[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar199[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar199[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar199[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar199[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar199[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar199[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar199[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar199[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar199[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar199[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar199[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar199[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar199[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar199[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar199[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar199[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar199[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar199[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar199[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar199[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar199[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar199[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar199[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar199[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar199[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar199[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar199[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar199[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar199[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar199[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar199[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar199[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar199[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar199[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar199[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar199[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar199[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar199[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar199[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar199[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar199[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar199[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar199[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar199[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar199[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar199[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar199[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar199[0x3f];
                  local_180 = local_500._0_8_;
                  uStack_178 = local_500._8_8_;
                  uStack_170 = local_500._16_8_;
                  uStack_168 = local_500._24_8_;
                  uStack_160 = local_500._32_8_;
                  uStack_158 = local_500._40_8_;
                  uStack_150 = local_500._48_8_;
                  uStack_148 = local_500._56_8_;
                  auVar199 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar199);
                  auVar123 = vpcmpeqd_avx2(auVar199._0_32_,auVar199._0_32_);
                  local_908[3] = auVar123;
                  local_908[2] = auVar123;
                  local_908[1] = auVar123;
                  *local_908 = auVar123;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instPrimID[0]));
                  local_600 = local_300;
                  local_940.valid = (int *)local_600;
                  local_940.geometryUserPtr = *(void **)(CONCAT44(uStack_7bc,local_7c0) + 0x18);
                  local_940.hit = local_2c0;
                  local_940.N = 0x10;
                  pcVar14 = *(code **)(CONCAT44(uStack_7bc,local_7c0) + 0x40);
                  local_7a0._0_8_ = uVar100;
                  local_940.ray = (RTCRayN *)ray;
                  if (pcVar14 != (code *)0x0) {
                    (*pcVar14)(&local_940);
                    auVar235 = ZEXT3264(local_8a0);
                    auVar183 = ZEXT3264(local_880);
                    auVar230 = ZEXT3264(local_900);
                    auVar231 = ZEXT3264(local_780);
                    auVar232 = ZEXT3264(local_760);
                    in_ZMM21 = ZEXT3264(local_860);
                    in_ZMM20 = ZEXT3264(local_840);
                    auVar113 = vxorps_avx512vl(auVar233,auVar233);
                    auVar234 = ZEXT1664(auVar113);
                    uVar100 = local_7a0._0_8_;
                    uVar219 = local_7e0._0_4_;
                  }
                  auVar113 = auVar234._0_16_;
                  auVar199 = vmovdqa64_avx512f(local_600);
                  uVar171 = vptestmd_avx512f(auVar199,auVar199);
                  if ((short)uVar171 == 0) {
LAB_01d257bf:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_740._0_4_;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_7bc,local_7c0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var13)(&local_940);
                      auVar235 = ZEXT3264(local_8a0);
                      auVar183 = ZEXT3264(local_880);
                      auVar230 = ZEXT3264(local_900);
                      auVar231 = ZEXT3264(local_780);
                      auVar232 = ZEXT3264(local_760);
                      in_ZMM21 = ZEXT3264(local_860);
                      in_ZMM20 = ZEXT3264(local_840);
                      auVar113 = vxorps_avx512vl(auVar113,auVar113);
                      auVar234 = ZEXT1664(auVar113);
                      uVar100 = local_7a0._0_8_;
                      uVar219 = local_7e0._0_4_;
                    }
                    auVar199 = vmovdqa64_avx512f(local_600);
                    uVar104 = vptestmd_avx512f(auVar199,auVar199);
                    if ((short)uVar104 == 0) goto LAB_01d257bf;
                    iVar1 = *(int *)(local_940.hit + 4);
                    iVar2 = *(int *)(local_940.hit + 8);
                    iVar80 = *(int *)(local_940.hit + 0xc);
                    iVar81 = *(int *)(local_940.hit + 0x10);
                    iVar82 = *(int *)(local_940.hit + 0x14);
                    iVar83 = *(int *)(local_940.hit + 0x18);
                    iVar84 = *(int *)(local_940.hit + 0x1c);
                    iVar85 = *(int *)(local_940.hit + 0x20);
                    iVar86 = *(int *)(local_940.hit + 0x24);
                    iVar87 = *(int *)(local_940.hit + 0x28);
                    iVar88 = *(int *)(local_940.hit + 0x2c);
                    iVar89 = *(int *)(local_940.hit + 0x30);
                    iVar90 = *(int *)(local_940.hit + 0x34);
                    iVar91 = *(int *)(local_940.hit + 0x38);
                    iVar92 = *(int *)(local_940.hit + 0x3c);
                    bVar99 = (byte)uVar104;
                    bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                    bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                    bVar98 = (byte)(uVar104 >> 8);
                    bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                    bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                    bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                    bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                    bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                    bVar28 = SUB81(uVar104 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x300) =
                         (uint)(bVar99 & 1) * *(int *)local_940.hit |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x300);
                    *(uint *)(local_940.ray + 0x304) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x304);
                    *(uint *)(local_940.ray + 0x308) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x308);
                    *(uint *)(local_940.ray + 0x30c) =
                         (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x30c);
                    *(uint *)(local_940.ray + 0x310) =
                         (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x310);
                    *(uint *)(local_940.ray + 0x314) =
                         (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x314);
                    *(uint *)(local_940.ray + 0x318) =
                         (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x318);
                    *(uint *)(local_940.ray + 0x31c) =
                         (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x31c);
                    *(uint *)(local_940.ray + 800) =
                         (uint)(bVar98 & 1) * iVar85 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_940.ray + 800);
                    *(uint *)(local_940.ray + 0x324) =
                         (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x324);
                    *(uint *)(local_940.ray + 0x328) =
                         (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x328);
                    *(uint *)(local_940.ray + 0x32c) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x32c);
                    *(uint *)(local_940.ray + 0x330) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x330);
                    *(uint *)(local_940.ray + 0x334) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x334);
                    *(uint *)(local_940.ray + 0x338) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x338);
                    *(uint *)(local_940.ray + 0x33c) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x33c);
                    iVar1 = *(int *)(local_940.hit + 0x44);
                    iVar2 = *(int *)(local_940.hit + 0x48);
                    iVar80 = *(int *)(local_940.hit + 0x4c);
                    iVar81 = *(int *)(local_940.hit + 0x50);
                    iVar82 = *(int *)(local_940.hit + 0x54);
                    iVar83 = *(int *)(local_940.hit + 0x58);
                    iVar84 = *(int *)(local_940.hit + 0x5c);
                    iVar85 = *(int *)(local_940.hit + 0x60);
                    iVar86 = *(int *)(local_940.hit + 100);
                    iVar87 = *(int *)(local_940.hit + 0x68);
                    iVar88 = *(int *)(local_940.hit + 0x6c);
                    iVar89 = *(int *)(local_940.hit + 0x70);
                    iVar90 = *(int *)(local_940.hit + 0x74);
                    iVar91 = *(int *)(local_940.hit + 0x78);
                    iVar92 = *(int *)(local_940.hit + 0x7c);
                    bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                    bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                    bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                    bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                    bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                    bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                    bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                    bVar28 = SUB81(uVar104 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x340) =
                         (uint)(bVar99 & 1) * *(int *)(local_940.hit + 0x40) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x340);
                    *(uint *)(local_940.ray + 0x344) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x344);
                    *(uint *)(local_940.ray + 0x348) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x348);
                    *(uint *)(local_940.ray + 0x34c) =
                         (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x34c);
                    *(uint *)(local_940.ray + 0x350) =
                         (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x350);
                    *(uint *)(local_940.ray + 0x354) =
                         (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x354);
                    *(uint *)(local_940.ray + 0x358) =
                         (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x358);
                    *(uint *)(local_940.ray + 0x35c) =
                         (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x35c);
                    *(uint *)(local_940.ray + 0x360) =
                         (uint)(bVar98 & 1) * iVar85 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_940.ray + 0x360);
                    *(uint *)(local_940.ray + 0x364) =
                         (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x364);
                    *(uint *)(local_940.ray + 0x368) =
                         (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x368);
                    *(uint *)(local_940.ray + 0x36c) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x36c);
                    *(uint *)(local_940.ray + 0x370) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x370);
                    *(uint *)(local_940.ray + 0x374) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x374);
                    *(uint *)(local_940.ray + 0x378) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x378);
                    *(uint *)(local_940.ray + 0x37c) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x37c);
                    iVar1 = *(int *)(local_940.hit + 0x84);
                    iVar2 = *(int *)(local_940.hit + 0x88);
                    iVar80 = *(int *)(local_940.hit + 0x8c);
                    iVar81 = *(int *)(local_940.hit + 0x90);
                    iVar82 = *(int *)(local_940.hit + 0x94);
                    iVar83 = *(int *)(local_940.hit + 0x98);
                    iVar84 = *(int *)(local_940.hit + 0x9c);
                    iVar85 = *(int *)(local_940.hit + 0xa0);
                    iVar86 = *(int *)(local_940.hit + 0xa4);
                    iVar87 = *(int *)(local_940.hit + 0xa8);
                    iVar88 = *(int *)(local_940.hit + 0xac);
                    iVar89 = *(int *)(local_940.hit + 0xb0);
                    iVar90 = *(int *)(local_940.hit + 0xb4);
                    iVar91 = *(int *)(local_940.hit + 0xb8);
                    iVar92 = *(int *)(local_940.hit + 0xbc);
                    bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                    bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                    bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                    bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                    bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                    bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                    bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                    bVar28 = SUB81(uVar104 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x380) =
                         (uint)(bVar99 & 1) * *(int *)(local_940.hit + 0x80) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x380);
                    *(uint *)(local_940.ray + 900) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 900);
                    *(uint *)(local_940.ray + 0x388) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x388);
                    *(uint *)(local_940.ray + 0x38c) =
                         (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x38c);
                    *(uint *)(local_940.ray + 0x390) =
                         (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x390);
                    *(uint *)(local_940.ray + 0x394) =
                         (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x394);
                    *(uint *)(local_940.ray + 0x398) =
                         (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x398);
                    *(uint *)(local_940.ray + 0x39c) =
                         (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x39c);
                    *(uint *)(local_940.ray + 0x3a0) =
                         (uint)(bVar98 & 1) * iVar85 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_940.ray + 0x3a0);
                    *(uint *)(local_940.ray + 0x3a4) =
                         (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x3a4);
                    *(uint *)(local_940.ray + 0x3a8) =
                         (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x3a8);
                    *(uint *)(local_940.ray + 0x3ac) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3ac);
                    *(uint *)(local_940.ray + 0x3b0) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3b0);
                    *(uint *)(local_940.ray + 0x3b4) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3b4);
                    *(uint *)(local_940.ray + 0x3b8) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3b8);
                    *(uint *)(local_940.ray + 0x3bc) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x3bc);
                    iVar1 = *(int *)(local_940.hit + 0xc4);
                    iVar2 = *(int *)(local_940.hit + 200);
                    iVar80 = *(int *)(local_940.hit + 0xcc);
                    iVar81 = *(int *)(local_940.hit + 0xd0);
                    iVar82 = *(int *)(local_940.hit + 0xd4);
                    iVar83 = *(int *)(local_940.hit + 0xd8);
                    iVar84 = *(int *)(local_940.hit + 0xdc);
                    iVar85 = *(int *)(local_940.hit + 0xe0);
                    iVar86 = *(int *)(local_940.hit + 0xe4);
                    iVar87 = *(int *)(local_940.hit + 0xe8);
                    iVar88 = *(int *)(local_940.hit + 0xec);
                    iVar89 = *(int *)(local_940.hit + 0xf0);
                    iVar90 = *(int *)(local_940.hit + 0xf4);
                    iVar91 = *(int *)(local_940.hit + 0xf8);
                    iVar92 = *(int *)(local_940.hit + 0xfc);
                    bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                    bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                    bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                    bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                    bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                    bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                    bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                    bVar28 = SUB81(uVar104 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x3c0) =
                         (uint)(bVar99 & 1) * *(int *)(local_940.hit + 0xc0) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x3c0);
                    *(uint *)(local_940.ray + 0x3c4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x3c4);
                    *(uint *)(local_940.ray + 0x3c8) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x3c8);
                    *(uint *)(local_940.ray + 0x3cc) =
                         (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x3cc);
                    *(uint *)(local_940.ray + 0x3d0) =
                         (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x3d0);
                    *(uint *)(local_940.ray + 0x3d4) =
                         (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x3d4);
                    *(uint *)(local_940.ray + 0x3d8) =
                         (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x3d8);
                    *(uint *)(local_940.ray + 0x3dc) =
                         (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x3dc);
                    *(uint *)(local_940.ray + 0x3e0) =
                         (uint)(bVar98 & 1) * iVar85 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_940.ray + 0x3e0);
                    *(uint *)(local_940.ray + 0x3e4) =
                         (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x3e4);
                    *(uint *)(local_940.ray + 1000) =
                         (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 1000);
                    *(uint *)(local_940.ray + 0x3ec) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3ec);
                    *(uint *)(local_940.ray + 0x3f0) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3f0);
                    *(uint *)(local_940.ray + 0x3f4) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3f4);
                    *(uint *)(local_940.ray + 0x3f8) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3f8);
                    *(uint *)(local_940.ray + 0x3fc) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x3fc);
                    iVar1 = *(int *)(local_940.hit + 0x104);
                    iVar2 = *(int *)(local_940.hit + 0x108);
                    iVar80 = *(int *)(local_940.hit + 0x10c);
                    iVar81 = *(int *)(local_940.hit + 0x110);
                    iVar82 = *(int *)(local_940.hit + 0x114);
                    iVar83 = *(int *)(local_940.hit + 0x118);
                    iVar84 = *(int *)(local_940.hit + 0x11c);
                    iVar85 = *(int *)(local_940.hit + 0x120);
                    iVar86 = *(int *)(local_940.hit + 0x124);
                    iVar87 = *(int *)(local_940.hit + 0x128);
                    iVar88 = *(int *)(local_940.hit + 300);
                    iVar89 = *(int *)(local_940.hit + 0x130);
                    iVar90 = *(int *)(local_940.hit + 0x134);
                    iVar91 = *(int *)(local_940.hit + 0x138);
                    iVar92 = *(int *)(local_940.hit + 0x13c);
                    bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                    bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                    bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                    bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                    bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                    bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                    bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                    bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                    bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                    bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                    bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                    bVar28 = SUB81(uVar104 >> 0xf,0);
                    *(uint *)(local_940.ray + 0x400) =
                         (uint)(bVar99 & 1) * *(int *)(local_940.hit + 0x100) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x400);
                    *(uint *)(local_940.ray + 0x404) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x404);
                    *(uint *)(local_940.ray + 0x408) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x408);
                    *(uint *)(local_940.ray + 0x40c) =
                         (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x40c);
                    *(uint *)(local_940.ray + 0x410) =
                         (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x410);
                    *(uint *)(local_940.ray + 0x414) =
                         (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x414);
                    *(uint *)(local_940.ray + 0x418) =
                         (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x418);
                    *(uint *)(local_940.ray + 0x41c) =
                         (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x41c);
                    *(uint *)(local_940.ray + 0x420) =
                         (uint)(bVar98 & 1) * iVar85 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_940.ray + 0x420);
                    *(uint *)(local_940.ray + 0x424) =
                         (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x424);
                    *(uint *)(local_940.ray + 0x428) =
                         (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x428);
                    *(uint *)(local_940.ray + 0x42c) =
                         (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x42c);
                    *(uint *)(local_940.ray + 0x430) =
                         (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x430);
                    *(uint *)(local_940.ray + 0x434) =
                         (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x434);
                    *(uint *)(local_940.ray + 0x438) =
                         (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x438);
                    *(uint *)(local_940.ray + 0x43c) =
                         (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x43c);
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x140));
                    auVar199 = vmovdqu32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x440) = auVar199;
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x180));
                    auVar199 = vmovdqu32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x480) = auVar199;
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x1c0));
                    auVar199 = vmovdqa32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x4c0) = auVar199;
                    auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x200));
                    auVar199 = vmovdqa32_avx512f(auVar199);
                    *(undefined1 (*) [64])(local_940.ray + 0x500) = auVar199;
                  }
                  auVar216 = ZEXT3264(auVar133);
                  auVar199 = ZEXT3264(auVar121);
                  bVar99 = ~(byte)(1 << ((uint)uVar100 & 0x1f)) & bVar108;
                  uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar42._4_4_ = uVar170;
                  auVar42._0_4_ = uVar170;
                  auVar42._8_4_ = uVar170;
                  auVar42._12_4_ = uVar170;
                  auVar42._16_4_ = uVar170;
                  auVar42._20_4_ = uVar170;
                  auVar42._24_4_ = uVar170;
                  auVar42._28_4_ = uVar170;
                  uVar171 = vcmpps_avx512vl(auVar121,auVar42,2);
                  bVar108 = bVar99 & (byte)uVar171;
                  if ((bVar99 & (byte)uVar171) != 0) {
                    auVar182._8_4_ = 0x7f800000;
                    auVar182._0_8_ = 0x7f8000007f800000;
                    auVar182._12_4_ = 0x7f800000;
                    auVar182._16_4_ = 0x7f800000;
                    auVar182._20_4_ = 0x7f800000;
                    auVar182._24_4_ = 0x7f800000;
                    auVar182._28_4_ = 0x7f800000;
                    auVar123 = vblendmps_avx512vl(auVar182,auVar121);
                    auVar159._0_4_ =
                         (uint)(bVar108 & 1) * auVar123._0_4_ |
                         (uint)!(bool)(bVar108 & 1) * 0x7f800000;
                    bVar15 = (bool)(bVar108 >> 1 & 1);
                    auVar159._4_4_ = (uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar108 >> 2 & 1);
                    auVar159._8_4_ = (uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar108 >> 3 & 1);
                    auVar159._12_4_ = (uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar108 >> 4 & 1);
                    auVar159._16_4_ = (uint)bVar15 * auVar123._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar108 >> 5 & 1);
                    auVar159._20_4_ = (uint)bVar15 * auVar123._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar108 >> 6 & 1);
                    auVar159._24_4_ = (uint)bVar15 * auVar123._24_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar159._28_4_ =
                         (uint)(bVar108 >> 7) * auVar123._28_4_ |
                         (uint)!(bool)(bVar108 >> 7) * 0x7f800000;
                    auVar123 = vshufps_avx(auVar159,auVar159,0xb1);
                    auVar123 = vminps_avx(auVar159,auVar123);
                    auVar134 = vshufpd_avx(auVar123,auVar123,5);
                    auVar123 = vminps_avx(auVar123,auVar134);
                    auVar134 = vpermpd_avx2(auVar123,0x4e);
                    auVar123 = vminps_avx(auVar123,auVar134);
                    uVar171 = vcmpps_avx512vl(auVar159,auVar123,0);
                    bVar98 = (byte)uVar171 & bVar108;
                    bVar99 = bVar108;
                    if (bVar98 != 0) {
                      bVar99 = bVar98;
                    }
                    uVar102 = 0;
                    for (uVar101 = (uint)bVar99; (uVar101 & 1) == 0;
                        uVar101 = uVar101 >> 1 | 0x80000000) {
                      uVar102 = uVar102 + 1;
                    }
                    uVar100 = (ulong)uVar102;
                  }
                } while (bVar108 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_7a0 = vpbroadcastd_avx512vl();
        local_740 = vbroadcastss_avx512vl(auVar114);
        fStack_7d0 = 1.0 / (float)local_540._0_4_;
        local_7e0._4_4_ = fStack_7d0;
        local_7e0._0_4_ = fStack_7d0;
        fStack_7d8 = fStack_7d0;
        fStack_7d4 = fStack_7d0;
        auVar160 = vpbroadcastd_avx512f();
        local_540 = vmovdqa64_avx512f(auVar160);
        auVar160 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar160);
        lVar105 = 8;
        auVar121 = auVar216._0_32_;
        auVar123 = auVar199._0_32_;
        fStack_7cc = fStack_7d0;
        fStack_7c8 = fStack_7d0;
        fStack_7c4 = fStack_7d0;
        local_7c0 = uVar219;
        uStack_7bc = uVar219;
        uStack_7b8 = uVar219;
        uStack_7b4 = uVar219;
        uStack_7b0 = uVar219;
        uStack_7ac = uVar219;
        uStack_7a8 = uVar219;
        uStack_7a4 = uVar219;
        do {
          auVar133 = vpbroadcastd_avx512vl();
          auVar124 = vpor_avx2(auVar133,_DAT_0205a920);
          uVar30 = vpcmpd_avx512vl(auVar124,local_7a0,1);
          auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar105 * 4 + lVar31);
          auVar134 = *(undefined1 (*) [32])(lVar31 + 0x2227768 + lVar105 * 4);
          auVar132 = *(undefined1 (*) [32])(lVar31 + 0x2227bec + lVar105 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar31 + 0x2228070 + lVar105 * 4);
          local_880 = auVar183._0_32_;
          auVar125 = vmulps_avx512vl(local_880,auVar122);
          local_8a0 = auVar235._0_32_;
          auVar131 = vmulps_avx512vl(local_8a0,auVar122);
          auVar60._4_4_ = auVar122._4_4_ * (float)local_3e0._4_4_;
          auVar60._0_4_ = auVar122._0_4_ * (float)local_3e0._0_4_;
          auVar60._8_4_ = auVar122._8_4_ * fStack_3d8;
          auVar60._12_4_ = auVar122._12_4_ * fStack_3d4;
          auVar60._16_4_ = auVar122._16_4_ * fStack_3d0;
          auVar60._20_4_ = auVar122._20_4_ * fStack_3cc;
          auVar60._24_4_ = auVar122._24_4_ * fStack_3c8;
          auVar60._28_4_ = auVar124._28_4_;
          auVar124 = vfmadd231ps_avx512vl(auVar125,auVar132,local_340);
          auVar125 = vfmadd231ps_avx512vl(auVar131,auVar132,local_360);
          auVar131 = vfmadd231ps_avx512vl(auVar60,auVar132,local_3c0);
          auVar214 = auVar230._0_32_;
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar134,auVar214);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar134,local_580);
          auVar114 = vfmadd231ps_fma(auVar131,auVar134,local_3a0);
          auVar217 = auVar232._0_32_;
          auVar127 = vfmadd231ps_avx512vl(auVar124,auVar133,auVar217);
          auVar215 = auVar231._0_32_;
          auVar118 = vfmadd231ps_avx512vl(auVar125,auVar133,auVar215);
          auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar105 * 4 + lVar31);
          auVar125 = *(undefined1 (*) [32])(lVar31 + 0x2229b88 + lVar105 * 4);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar133,local_380);
          auVar131 = *(undefined1 (*) [32])(lVar31 + 0x222a00c + lVar105 * 4);
          auVar130 = *(undefined1 (*) [32])(lVar31 + 0x222a490 + lVar105 * 4);
          auVar120 = vmulps_avx512vl(local_880,auVar130);
          auVar126 = vmulps_avx512vl(local_8a0,auVar130);
          auVar61._4_4_ = auVar130._4_4_ * (float)local_3e0._4_4_;
          auVar61._0_4_ = auVar130._0_4_ * (float)local_3e0._0_4_;
          auVar61._8_4_ = auVar130._8_4_ * fStack_3d8;
          auVar61._12_4_ = auVar130._12_4_ * fStack_3d4;
          auVar61._16_4_ = auVar130._16_4_ * fStack_3d0;
          auVar61._20_4_ = auVar130._20_4_ * fStack_3cc;
          auVar61._24_4_ = auVar130._24_4_ * fStack_3c8;
          auVar61._28_4_ = uStack_3c4;
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar131,local_340);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar131,local_360);
          auVar119 = vfmadd231ps_avx512vl(auVar61,auVar131,local_3c0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar125,auVar214);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar125,local_580);
          auVar113 = vfmadd231ps_fma(auVar119,auVar125,local_3a0);
          auVar119 = vfmadd231ps_avx512vl(auVar120,auVar124,auVar217);
          auVar128 = vfmadd231ps_avx512vl(auVar126,auVar124,auVar215);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar124,local_380);
          auVar129 = vmaxps_avx512vl(ZEXT1632(auVar114),ZEXT1632(auVar113));
          auVar120 = vsubps_avx(auVar119,auVar127);
          auVar126 = vsubps_avx(auVar128,auVar118);
          auVar146 = vmulps_avx512vl(auVar118,auVar120);
          auVar147 = vmulps_avx512vl(auVar127,auVar126);
          auVar146 = vsubps_avx512vl(auVar146,auVar147);
          auVar147 = vmulps_avx512vl(auVar126,auVar126);
          auVar147 = vfmadd231ps_avx512vl(auVar147,auVar120,auVar120);
          auVar129 = vmulps_avx512vl(auVar129,auVar129);
          auVar129 = vmulps_avx512vl(auVar129,auVar147);
          auVar146 = vmulps_avx512vl(auVar146,auVar146);
          uVar171 = vcmpps_avx512vl(auVar146,auVar129,2);
          local_670 = (byte)uVar30 & (byte)uVar171;
          if (local_670 == 0) {
            auVar160 = ZEXT3264(auVar215);
            auVar230 = ZEXT3264(auVar214);
          }
          else {
            auVar130 = vmulps_avx512vl(local_460,auVar130);
            auVar131 = vfmadd213ps_avx512vl(auVar131,local_440,auVar130);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_420,auVar131);
            auVar124 = vfmadd213ps_avx512vl(auVar124,local_400,auVar125);
            auVar122 = vmulps_avx512vl(local_460,auVar122);
            auVar132 = vfmadd213ps_avx512vl(auVar132,local_440,auVar122);
            auVar134 = vfmadd213ps_avx512vl(auVar134,local_420,auVar132);
            auVar125 = vfmadd213ps_avx512vl(auVar133,local_400,auVar134);
            auVar133 = *(undefined1 (*) [32])(lVar31 + 0x22284f4 + lVar105 * 4);
            auVar134 = *(undefined1 (*) [32])(lVar31 + 0x2228978 + lVar105 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar31 + 0x2228dfc + lVar105 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar31 + 0x2229280 + lVar105 * 4);
            auVar131 = vmulps_avx512vl(local_880,auVar122);
            auVar130 = vmulps_avx512vl(local_8a0,auVar122);
            auVar122 = vmulps_avx512vl(local_460,auVar122);
            auVar131 = vfmadd231ps_avx512vl(auVar131,auVar132,local_340);
            auVar130 = vfmadd231ps_avx512vl(auVar130,auVar132,local_360);
            auVar132 = vfmadd231ps_avx512vl(auVar122,local_440,auVar132);
            auVar122 = vfmadd231ps_avx512vl(auVar131,auVar134,auVar214);
            auVar131 = vfmadd231ps_avx512vl(auVar130,auVar134,local_580);
            auVar134 = vfmadd231ps_avx512vl(auVar132,local_420,auVar134);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar133,auVar217);
            auVar131 = vfmadd231ps_avx512vl(auVar131,auVar133,auVar215);
            auVar130 = vfmadd231ps_avx512vl(auVar134,local_400,auVar133);
            auVar133 = *(undefined1 (*) [32])(lVar31 + 0x222a914 + lVar105 * 4);
            auVar134 = *(undefined1 (*) [32])(lVar31 + 0x222b21c + lVar105 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar31 + 0x222b6a0 + lVar105 * 4);
            auVar129 = vmulps_avx512vl(local_880,auVar132);
            auVar146 = vmulps_avx512vl(local_8a0,auVar132);
            auVar132 = vmulps_avx512vl(local_460,auVar132);
            auVar129 = vfmadd231ps_avx512vl(auVar129,auVar134,local_340);
            auVar146 = vfmadd231ps_avx512vl(auVar146,auVar134,local_360);
            auVar132 = vfmadd231ps_avx512vl(auVar132,local_440,auVar134);
            auVar134 = *(undefined1 (*) [32])(lVar31 + 0x222ad98 + lVar105 * 4);
            auVar129 = vfmadd231ps_avx512vl(auVar129,auVar134,auVar214);
            auVar111 = vfmadd231ps_fma(auVar146,auVar134,local_580);
            auVar134 = vfmadd231ps_avx512vl(auVar132,local_420,auVar134);
            auVar132 = vfmadd231ps_avx512vl(auVar129,auVar133,auVar217);
            auVar129 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar133,auVar215);
            auVar134 = vfmadd231ps_avx512vl(auVar134,local_400,auVar133);
            auVar146 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar122,auVar146);
            vandps_avx512vl(auVar131,auVar146);
            auVar133 = vmaxps_avx(auVar146,auVar146);
            vandps_avx512vl(auVar130,auVar146);
            auVar133 = vmaxps_avx(auVar133,auVar146);
            uVar100 = vcmpps_avx512vl(auVar133,local_740,1);
            bVar15 = (bool)((byte)uVar100 & 1);
            auVar148._0_4_ = (float)((uint)bVar15 * auVar120._0_4_ | (uint)!bVar15 * auVar122._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar148._4_4_ = (float)((uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * auVar122._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar148._8_4_ = (float)((uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * auVar122._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar148._12_4_ =
                 (float)((uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * auVar122._12_4_);
            bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar148._16_4_ =
                 (float)((uint)bVar15 * auVar120._16_4_ | (uint)!bVar15 * auVar122._16_4_);
            bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar148._20_4_ =
                 (float)((uint)bVar15 * auVar120._20_4_ | (uint)!bVar15 * auVar122._20_4_);
            bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar148._24_4_ =
                 (float)((uint)bVar15 * auVar120._24_4_ | (uint)!bVar15 * auVar122._24_4_);
            bVar15 = SUB81(uVar100 >> 7,0);
            auVar148._28_4_ = (uint)bVar15 * auVar120._28_4_ | (uint)!bVar15 * auVar122._28_4_;
            bVar15 = (bool)((byte)uVar100 & 1);
            auVar149._0_4_ = (float)((uint)bVar15 * auVar126._0_4_ | (uint)!bVar15 * auVar131._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar149._4_4_ = (float)((uint)bVar15 * auVar126._4_4_ | (uint)!bVar15 * auVar131._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar149._8_4_ = (float)((uint)bVar15 * auVar126._8_4_ | (uint)!bVar15 * auVar131._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar149._12_4_ =
                 (float)((uint)bVar15 * auVar126._12_4_ | (uint)!bVar15 * auVar131._12_4_);
            bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar149._16_4_ =
                 (float)((uint)bVar15 * auVar126._16_4_ | (uint)!bVar15 * auVar131._16_4_);
            bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar149._20_4_ =
                 (float)((uint)bVar15 * auVar126._20_4_ | (uint)!bVar15 * auVar131._20_4_);
            bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar149._24_4_ =
                 (float)((uint)bVar15 * auVar126._24_4_ | (uint)!bVar15 * auVar131._24_4_);
            bVar15 = SUB81(uVar100 >> 7,0);
            auVar149._28_4_ = (uint)bVar15 * auVar126._28_4_ | (uint)!bVar15 * auVar131._28_4_;
            vandps_avx512vl(auVar132,auVar146);
            vandps_avx512vl(auVar129,auVar146);
            auVar133 = vmaxps_avx(auVar149,auVar149);
            vandps_avx512vl(auVar134,auVar146);
            auVar133 = vmaxps_avx(auVar133,auVar149);
            uVar100 = vcmpps_avx512vl(auVar133,local_740,1);
            bVar15 = (bool)((byte)uVar100 & 1);
            auVar150._0_4_ = (uint)bVar15 * auVar120._0_4_ | (uint)!bVar15 * auVar132._0_4_;
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * auVar132._4_4_;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * auVar132._8_4_;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * auVar132._12_4_;
            bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar150._16_4_ = (uint)bVar15 * auVar120._16_4_ | (uint)!bVar15 * auVar132._16_4_;
            bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar150._20_4_ = (uint)bVar15 * auVar120._20_4_ | (uint)!bVar15 * auVar132._20_4_;
            bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar150._24_4_ = (uint)bVar15 * auVar120._24_4_ | (uint)!bVar15 * auVar132._24_4_;
            bVar15 = SUB81(uVar100 >> 7,0);
            auVar150._28_4_ = (uint)bVar15 * auVar120._28_4_ | (uint)!bVar15 * auVar132._28_4_;
            bVar15 = (bool)((byte)uVar100 & 1);
            auVar151._0_4_ = (float)((uint)bVar15 * auVar126._0_4_ | (uint)!bVar15 * auVar129._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar151._4_4_ = (float)((uint)bVar15 * auVar126._4_4_ | (uint)!bVar15 * auVar129._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar151._8_4_ = (float)((uint)bVar15 * auVar126._8_4_ | (uint)!bVar15 * auVar129._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar151._12_4_ =
                 (float)((uint)bVar15 * auVar126._12_4_ | (uint)!bVar15 * auVar129._12_4_);
            bVar15 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar151._16_4_ =
                 (float)((uint)bVar15 * auVar126._16_4_ | (uint)!bVar15 * auVar129._16_4_);
            bVar15 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar151._20_4_ =
                 (float)((uint)bVar15 * auVar126._20_4_ | (uint)!bVar15 * auVar129._20_4_);
            bVar15 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar151._24_4_ =
                 (float)((uint)bVar15 * auVar126._24_4_ | (uint)!bVar15 * auVar129._24_4_);
            bVar15 = SUB81(uVar100 >> 7,0);
            auVar151._28_4_ = (uint)bVar15 * auVar126._28_4_ | (uint)!bVar15 * auVar129._28_4_;
            auVar221._8_4_ = 0x80000000;
            auVar221._0_8_ = 0x8000000080000000;
            auVar221._12_4_ = 0x80000000;
            auVar221._16_4_ = 0x80000000;
            auVar221._20_4_ = 0x80000000;
            auVar221._24_4_ = 0x80000000;
            auVar221._28_4_ = 0x80000000;
            auVar133 = vxorps_avx512vl(auVar150,auVar221);
            auVar129 = auVar234._0_32_;
            auVar134 = vfmadd213ps_avx512vl(auVar148,auVar148,auVar129);
            auVar111 = vfmadd231ps_fma(auVar134,auVar149,auVar149);
            auVar134 = vrsqrt14ps_avx512vl(ZEXT1632(auVar111));
            auVar229._8_4_ = 0xbf000000;
            auVar229._0_8_ = 0xbf000000bf000000;
            auVar229._12_4_ = 0xbf000000;
            auVar229._16_4_ = 0xbf000000;
            auVar229._20_4_ = 0xbf000000;
            auVar229._24_4_ = 0xbf000000;
            auVar229._28_4_ = 0xbf000000;
            fVar201 = auVar134._0_4_;
            fVar169 = auVar134._4_4_;
            fVar206 = auVar134._8_4_;
            fVar207 = auVar134._12_4_;
            fVar190 = auVar134._16_4_;
            fVar200 = auVar134._20_4_;
            fVar109 = auVar134._24_4_;
            auVar62._4_4_ = fVar169 * fVar169 * fVar169 * auVar111._4_4_ * -0.5;
            auVar62._0_4_ = fVar201 * fVar201 * fVar201 * auVar111._0_4_ * -0.5;
            auVar62._8_4_ = fVar206 * fVar206 * fVar206 * auVar111._8_4_ * -0.5;
            auVar62._12_4_ = fVar207 * fVar207 * fVar207 * auVar111._12_4_ * -0.5;
            auVar62._16_4_ = fVar190 * fVar190 * fVar190 * -0.0;
            auVar62._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
            auVar62._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar62._28_4_ = auVar149._28_4_;
            auVar132 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar134 = vfmadd231ps_avx512vl(auVar62,auVar132,auVar134);
            auVar63._4_4_ = auVar149._4_4_ * auVar134._4_4_;
            auVar63._0_4_ = auVar149._0_4_ * auVar134._0_4_;
            auVar63._8_4_ = auVar149._8_4_ * auVar134._8_4_;
            auVar63._12_4_ = auVar149._12_4_ * auVar134._12_4_;
            auVar63._16_4_ = auVar149._16_4_ * auVar134._16_4_;
            auVar63._20_4_ = auVar149._20_4_ * auVar134._20_4_;
            auVar63._24_4_ = auVar149._24_4_ * auVar134._24_4_;
            auVar63._28_4_ = 0;
            auVar64._4_4_ = auVar134._4_4_ * -auVar148._4_4_;
            auVar64._0_4_ = auVar134._0_4_ * -auVar148._0_4_;
            auVar64._8_4_ = auVar134._8_4_ * -auVar148._8_4_;
            auVar64._12_4_ = auVar134._12_4_ * -auVar148._12_4_;
            auVar64._16_4_ = auVar134._16_4_ * -auVar148._16_4_;
            auVar64._20_4_ = auVar134._20_4_ * -auVar148._20_4_;
            auVar64._24_4_ = auVar134._24_4_ * -auVar148._24_4_;
            auVar64._28_4_ = auVar149._28_4_;
            auVar122 = vmulps_avx512vl(auVar134,auVar129);
            auVar134 = vfmadd213ps_avx512vl(auVar150,auVar150,auVar129);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar151,auVar151);
            auVar131 = vrsqrt14ps_avx512vl(auVar134);
            auVar134 = vmulps_avx512vl(auVar134,auVar229);
            fVar201 = auVar131._0_4_;
            fVar169 = auVar131._4_4_;
            fVar206 = auVar131._8_4_;
            fVar207 = auVar131._12_4_;
            fVar190 = auVar131._16_4_;
            fVar200 = auVar131._20_4_;
            fVar109 = auVar131._24_4_;
            auVar65._4_4_ = fVar169 * fVar169 * fVar169 * auVar134._4_4_;
            auVar65._0_4_ = fVar201 * fVar201 * fVar201 * auVar134._0_4_;
            auVar65._8_4_ = fVar206 * fVar206 * fVar206 * auVar134._8_4_;
            auVar65._12_4_ = fVar207 * fVar207 * fVar207 * auVar134._12_4_;
            auVar65._16_4_ = fVar190 * fVar190 * fVar190 * auVar134._16_4_;
            auVar65._20_4_ = fVar200 * fVar200 * fVar200 * auVar134._20_4_;
            auVar65._24_4_ = fVar109 * fVar109 * fVar109 * auVar134._24_4_;
            auVar65._28_4_ = auVar134._28_4_;
            auVar134 = vfmadd231ps_avx512vl(auVar65,auVar132,auVar131);
            auVar66._4_4_ = auVar151._4_4_ * auVar134._4_4_;
            auVar66._0_4_ = auVar151._0_4_ * auVar134._0_4_;
            auVar66._8_4_ = auVar151._8_4_ * auVar134._8_4_;
            auVar66._12_4_ = auVar151._12_4_ * auVar134._12_4_;
            auVar66._16_4_ = auVar151._16_4_ * auVar134._16_4_;
            auVar66._20_4_ = auVar151._20_4_ * auVar134._20_4_;
            auVar66._24_4_ = auVar151._24_4_ * auVar134._24_4_;
            auVar66._28_4_ = auVar131._28_4_;
            auVar67._4_4_ = auVar134._4_4_ * auVar133._4_4_;
            auVar67._0_4_ = auVar134._0_4_ * auVar133._0_4_;
            auVar67._8_4_ = auVar134._8_4_ * auVar133._8_4_;
            auVar67._12_4_ = auVar134._12_4_ * auVar133._12_4_;
            auVar67._16_4_ = auVar134._16_4_ * auVar133._16_4_;
            auVar67._20_4_ = auVar134._20_4_ * auVar133._20_4_;
            auVar67._24_4_ = auVar134._24_4_ * auVar133._24_4_;
            auVar67._28_4_ = auVar133._28_4_;
            auVar133 = vmulps_avx512vl(auVar134,auVar129);
            auVar111 = vfmadd213ps_fma(auVar63,ZEXT1632(auVar114),auVar127);
            auVar134 = ZEXT1632(auVar114);
            auVar233 = vfmadd213ps_fma(auVar64,auVar134,auVar118);
            auVar132 = vfmadd213ps_avx512vl(auVar122,auVar134,auVar125);
            auVar131 = vfmadd213ps_avx512vl(auVar66,ZEXT1632(auVar113),auVar119);
            auVar115 = vfnmadd213ps_fma(auVar63,auVar134,auVar127);
            auVar130 = ZEXT1632(auVar113);
            auVar6 = vfmadd213ps_fma(auVar67,auVar130,auVar128);
            auVar116 = vfnmadd213ps_fma(auVar64,auVar134,auVar118);
            auVar7 = vfmadd213ps_fma(auVar133,auVar130,auVar124);
            auVar118 = ZEXT1632(auVar114);
            auVar220 = vfnmadd231ps_fma(auVar125,auVar118,auVar122);
            auVar191 = vfnmadd213ps_fma(auVar66,auVar130,auVar119);
            auVar192 = vfnmadd213ps_fma(auVar67,auVar130,auVar128);
            auVar117 = vfnmadd231ps_fma(auVar124,ZEXT1632(auVar113),auVar133);
            auVar124 = vsubps_avx512vl(auVar131,ZEXT1632(auVar115));
            auVar133 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar116));
            auVar134 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar220));
            auVar68._4_4_ = auVar133._4_4_ * auVar220._4_4_;
            auVar68._0_4_ = auVar133._0_4_ * auVar220._0_4_;
            auVar68._8_4_ = auVar133._8_4_ * auVar220._8_4_;
            auVar68._12_4_ = auVar133._12_4_ * auVar220._12_4_;
            auVar68._16_4_ = auVar133._16_4_ * 0.0;
            auVar68._20_4_ = auVar133._20_4_ * 0.0;
            auVar68._24_4_ = auVar133._24_4_ * 0.0;
            auVar68._28_4_ = auVar122._28_4_;
            auVar114 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar116),auVar134);
            auVar69._4_4_ = auVar134._4_4_ * auVar115._4_4_;
            auVar69._0_4_ = auVar134._0_4_ * auVar115._0_4_;
            auVar69._8_4_ = auVar134._8_4_ * auVar115._8_4_;
            auVar69._12_4_ = auVar134._12_4_ * auVar115._12_4_;
            auVar69._16_4_ = auVar134._16_4_ * 0.0;
            auVar69._20_4_ = auVar134._20_4_ * 0.0;
            auVar69._24_4_ = auVar134._24_4_ * 0.0;
            auVar69._28_4_ = auVar134._28_4_;
            auVar8 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar220),auVar124);
            auVar70._4_4_ = auVar116._4_4_ * auVar124._4_4_;
            auVar70._0_4_ = auVar116._0_4_ * auVar124._0_4_;
            auVar70._8_4_ = auVar116._8_4_ * auVar124._8_4_;
            auVar70._12_4_ = auVar116._12_4_ * auVar124._12_4_;
            auVar70._16_4_ = auVar124._16_4_ * 0.0;
            auVar70._20_4_ = auVar124._20_4_ * 0.0;
            auVar70._24_4_ = auVar124._24_4_ * 0.0;
            auVar70._28_4_ = auVar124._28_4_;
            auVar112 = vfmsub231ps_fma(auVar70,ZEXT1632(auVar115),auVar133);
            auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar112),auVar129,ZEXT1632(auVar8));
            auVar133 = vfmadd231ps_avx512vl(auVar133,auVar129,ZEXT1632(auVar114));
            uVar100 = vcmpps_avx512vl(auVar133,auVar129,2);
            bVar108 = (byte)uVar100;
            fVar161 = (float)((uint)(bVar108 & 1) * auVar111._0_4_ |
                             (uint)!(bool)(bVar108 & 1) * auVar191._0_4_);
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            fVar163 = (float)((uint)bVar15 * auVar111._4_4_ | (uint)!bVar15 * auVar191._4_4_);
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            fVar166 = (float)((uint)bVar15 * auVar111._8_4_ | (uint)!bVar15 * auVar191._8_4_);
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            fVar167 = (float)((uint)bVar15 * auVar111._12_4_ | (uint)!bVar15 * auVar191._12_4_);
            auVar130 = ZEXT1632(CONCAT412(fVar167,CONCAT48(fVar166,CONCAT44(fVar163,fVar161))));
            fVar162 = (float)((uint)(bVar108 & 1) * auVar233._0_4_ |
                             (uint)!(bool)(bVar108 & 1) * auVar192._0_4_);
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            fVar165 = (float)((uint)bVar15 * auVar233._4_4_ | (uint)!bVar15 * auVar192._4_4_);
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            fVar164 = (float)((uint)bVar15 * auVar233._8_4_ | (uint)!bVar15 * auVar192._8_4_);
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            fVar168 = (float)((uint)bVar15 * auVar233._12_4_ | (uint)!bVar15 * auVar192._12_4_);
            auVar120 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar164,CONCAT44(fVar165,fVar162))));
            auVar152._0_4_ =
                 (float)((uint)(bVar108 & 1) * auVar132._0_4_ |
                        (uint)!(bool)(bVar108 & 1) * auVar117._0_4_);
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar152._4_4_ = (float)((uint)bVar15 * auVar132._4_4_ | (uint)!bVar15 * auVar117._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar152._8_4_ = (float)((uint)bVar15 * auVar132._8_4_ | (uint)!bVar15 * auVar117._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar152._12_4_ =
                 (float)((uint)bVar15 * auVar132._12_4_ | (uint)!bVar15 * auVar117._12_4_);
            fVar201 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar132._16_4_);
            auVar152._16_4_ = fVar201;
            fVar169 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar132._20_4_);
            auVar152._20_4_ = fVar169;
            fVar206 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar132._24_4_);
            auVar152._24_4_ = fVar206;
            iVar1 = (uint)(byte)(uVar100 >> 7) * auVar132._28_4_;
            auVar152._28_4_ = iVar1;
            auVar133 = vblendmps_avx512vl(ZEXT1632(auVar115),auVar131);
            auVar153._0_4_ =
                 (uint)(bVar108 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar108 & 1) * auVar114._0_4_;
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar153._4_4_ = (uint)bVar15 * auVar133._4_4_ | (uint)!bVar15 * auVar114._4_4_;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar153._8_4_ = (uint)bVar15 * auVar133._8_4_ | (uint)!bVar15 * auVar114._8_4_;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar153._12_4_ = (uint)bVar15 * auVar133._12_4_ | (uint)!bVar15 * auVar114._12_4_;
            auVar153._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar133._16_4_;
            auVar153._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar133._20_4_;
            auVar153._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar133._24_4_;
            auVar153._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar133._28_4_;
            auVar133 = vblendmps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar6));
            auVar154._0_4_ =
                 (float)((uint)(bVar108 & 1) * auVar133._0_4_ |
                        (uint)!(bool)(bVar108 & 1) * auVar111._0_4_);
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar154._4_4_ = (float)((uint)bVar15 * auVar133._4_4_ | (uint)!bVar15 * auVar111._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar154._8_4_ = (float)((uint)bVar15 * auVar133._8_4_ | (uint)!bVar15 * auVar111._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar154._12_4_ =
                 (float)((uint)bVar15 * auVar133._12_4_ | (uint)!bVar15 * auVar111._12_4_);
            fVar190 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar133._16_4_);
            auVar154._16_4_ = fVar190;
            fVar200 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar133._20_4_);
            auVar154._20_4_ = fVar200;
            fVar207 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar133._24_4_);
            auVar154._24_4_ = fVar207;
            auVar154._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar133._28_4_;
            auVar133 = vblendmps_avx512vl(ZEXT1632(auVar220),ZEXT1632(auVar7));
            auVar155._0_4_ =
                 (float)((uint)(bVar108 & 1) * auVar133._0_4_ |
                        (uint)!(bool)(bVar108 & 1) * auVar233._0_4_);
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar155._4_4_ = (float)((uint)bVar15 * auVar133._4_4_ | (uint)!bVar15 * auVar233._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar155._8_4_ = (float)((uint)bVar15 * auVar133._8_4_ | (uint)!bVar15 * auVar233._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar155._12_4_ =
                 (float)((uint)bVar15 * auVar133._12_4_ | (uint)!bVar15 * auVar233._12_4_);
            fVar189 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar133._16_4_);
            auVar155._16_4_ = fVar189;
            fVar109 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar133._20_4_);
            auVar155._20_4_ = fVar109;
            fVar110 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar133._24_4_);
            auVar155._24_4_ = fVar110;
            iVar2 = (uint)(byte)(uVar100 >> 7) * auVar133._28_4_;
            auVar155._28_4_ = iVar2;
            auVar156._0_4_ =
                 (uint)(bVar108 & 1) * (int)auVar115._0_4_ |
                 (uint)!(bool)(bVar108 & 1) * auVar131._0_4_;
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar156._4_4_ = (uint)bVar15 * (int)auVar115._4_4_ | (uint)!bVar15 * auVar131._4_4_;
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar156._8_4_ = (uint)bVar15 * (int)auVar115._8_4_ | (uint)!bVar15 * auVar131._8_4_;
            bVar15 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar156._12_4_ = (uint)bVar15 * (int)auVar115._12_4_ | (uint)!bVar15 * auVar131._12_4_;
            auVar156._16_4_ = (uint)!(bool)((byte)(uVar100 >> 4) & 1) * auVar131._16_4_;
            auVar156._20_4_ = (uint)!(bool)((byte)(uVar100 >> 5) & 1) * auVar131._20_4_;
            auVar156._24_4_ = (uint)!(bool)((byte)(uVar100 >> 6) & 1) * auVar131._24_4_;
            auVar156._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar131._28_4_;
            bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar100 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar100 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar100 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar131 = vsubps_avx512vl(auVar156,auVar130);
            auVar134 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar116._12_4_ |
                                                     (uint)!bVar19 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar116._8_4_ |
                                                              (uint)!bVar17 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar116._4_4_ |
                                                                       (uint)!bVar15 * auVar6._4_4_,
                                                                       (uint)(bVar108 & 1) *
                                                                       (int)auVar116._0_4_ |
                                                                       (uint)!(bool)(bVar108 & 1) *
                                                                       auVar6._0_4_)))),auVar120);
            auVar132 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar220._12_4_ |
                                                     (uint)!bVar20 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar220._8_4_ |
                                                              (uint)!bVar18 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar220._4_4_ |
                                                                       (uint)!bVar16 * auVar7._4_4_,
                                                                       (uint)(bVar108 & 1) *
                                                                       (int)auVar220._0_4_ |
                                                                       (uint)!(bool)(bVar108 & 1) *
                                                                       auVar7._0_4_)))),auVar152);
            auVar122 = vsubps_avx(auVar130,auVar153);
            auVar124 = vsubps_avx(auVar120,auVar154);
            auVar125 = vsubps_avx(auVar152,auVar155);
            auVar71._4_4_ = auVar132._4_4_ * fVar163;
            auVar71._0_4_ = auVar132._0_4_ * fVar161;
            auVar71._8_4_ = auVar132._8_4_ * fVar166;
            auVar71._12_4_ = auVar132._12_4_ * fVar167;
            auVar71._16_4_ = auVar132._16_4_ * 0.0;
            auVar71._20_4_ = auVar132._20_4_ * 0.0;
            auVar71._24_4_ = auVar132._24_4_ * 0.0;
            auVar71._28_4_ = 0;
            auVar114 = vfmsub231ps_fma(auVar71,auVar152,auVar131);
            auVar198._0_4_ = fVar162 * auVar131._0_4_;
            auVar198._4_4_ = fVar165 * auVar131._4_4_;
            auVar198._8_4_ = fVar164 * auVar131._8_4_;
            auVar198._12_4_ = fVar168 * auVar131._12_4_;
            auVar198._16_4_ = auVar131._16_4_ * 0.0;
            auVar198._20_4_ = auVar131._20_4_ * 0.0;
            auVar198._24_4_ = auVar131._24_4_ * 0.0;
            auVar198._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar198,auVar130,auVar134);
            auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar129,ZEXT1632(auVar114));
            auVar204._0_4_ = auVar134._0_4_ * auVar152._0_4_;
            auVar204._4_4_ = auVar134._4_4_ * auVar152._4_4_;
            auVar204._8_4_ = auVar134._8_4_ * auVar152._8_4_;
            auVar204._12_4_ = auVar134._12_4_ * auVar152._12_4_;
            auVar204._16_4_ = auVar134._16_4_ * fVar201;
            auVar204._20_4_ = auVar134._20_4_ * fVar169;
            auVar204._24_4_ = auVar134._24_4_ * fVar206;
            auVar204._28_4_ = 0;
            auVar114 = vfmsub231ps_fma(auVar204,auVar120,auVar132);
            auVar126 = vfmadd231ps_avx512vl(auVar133,auVar129,ZEXT1632(auVar114));
            auVar133 = vmulps_avx512vl(auVar125,auVar153);
            auVar133 = vfmsub231ps_avx512vl(auVar133,auVar122,auVar155);
            auVar72._4_4_ = auVar124._4_4_ * auVar155._4_4_;
            auVar72._0_4_ = auVar124._0_4_ * auVar155._0_4_;
            auVar72._8_4_ = auVar124._8_4_ * auVar155._8_4_;
            auVar72._12_4_ = auVar124._12_4_ * auVar155._12_4_;
            auVar72._16_4_ = auVar124._16_4_ * fVar189;
            auVar72._20_4_ = auVar124._20_4_ * fVar109;
            auVar72._24_4_ = auVar124._24_4_ * fVar110;
            auVar72._28_4_ = iVar2;
            auVar114 = vfmsub231ps_fma(auVar72,auVar154,auVar125);
            auVar205._0_4_ = auVar154._0_4_ * auVar122._0_4_;
            auVar205._4_4_ = auVar154._4_4_ * auVar122._4_4_;
            auVar205._8_4_ = auVar154._8_4_ * auVar122._8_4_;
            auVar205._12_4_ = auVar154._12_4_ * auVar122._12_4_;
            auVar205._16_4_ = fVar190 * auVar122._16_4_;
            auVar205._20_4_ = fVar200 * auVar122._20_4_;
            auVar205._24_4_ = fVar207 * auVar122._24_4_;
            auVar205._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar205,auVar124,auVar153);
            auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),auVar129,auVar133);
            auVar127 = vfmadd231ps_avx512vl(auVar133,auVar129,ZEXT1632(auVar114));
            auVar133 = vmaxps_avx(auVar126,auVar127);
            uVar171 = vcmpps_avx512vl(auVar133,auVar129,2);
            local_670 = local_670 & (byte)uVar171;
            auVar160 = ZEXT3264(auVar215);
            if (local_670 == 0) {
LAB_01d24e02:
              local_670 = 0;
            }
            else {
              auVar73._4_4_ = auVar125._4_4_ * auVar134._4_4_;
              auVar73._0_4_ = auVar125._0_4_ * auVar134._0_4_;
              auVar73._8_4_ = auVar125._8_4_ * auVar134._8_4_;
              auVar73._12_4_ = auVar125._12_4_ * auVar134._12_4_;
              auVar73._16_4_ = auVar125._16_4_ * auVar134._16_4_;
              auVar73._20_4_ = auVar125._20_4_ * auVar134._20_4_;
              auVar73._24_4_ = auVar125._24_4_ * auVar134._24_4_;
              auVar73._28_4_ = auVar133._28_4_;
              auVar233 = vfmsub231ps_fma(auVar73,auVar124,auVar132);
              auVar74._4_4_ = auVar132._4_4_ * auVar122._4_4_;
              auVar74._0_4_ = auVar132._0_4_ * auVar122._0_4_;
              auVar74._8_4_ = auVar132._8_4_ * auVar122._8_4_;
              auVar74._12_4_ = auVar132._12_4_ * auVar122._12_4_;
              auVar74._16_4_ = auVar132._16_4_ * auVar122._16_4_;
              auVar74._20_4_ = auVar132._20_4_ * auVar122._20_4_;
              auVar74._24_4_ = auVar132._24_4_ * auVar122._24_4_;
              auVar74._28_4_ = auVar132._28_4_;
              auVar111 = vfmsub231ps_fma(auVar74,auVar131,auVar125);
              auVar75._4_4_ = auVar124._4_4_ * auVar131._4_4_;
              auVar75._0_4_ = auVar124._0_4_ * auVar131._0_4_;
              auVar75._8_4_ = auVar124._8_4_ * auVar131._8_4_;
              auVar75._12_4_ = auVar124._12_4_ * auVar131._12_4_;
              auVar75._16_4_ = auVar124._16_4_ * auVar131._16_4_;
              auVar75._20_4_ = auVar124._20_4_ * auVar131._20_4_;
              auVar75._24_4_ = auVar124._24_4_ * auVar131._24_4_;
              auVar75._28_4_ = auVar124._28_4_;
              auVar6 = vfmsub231ps_fma(auVar75,auVar122,auVar134);
              auVar114 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar111),ZEXT1632(auVar6));
              auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),ZEXT1632(auVar233),auVar129);
              auVar134 = vrcp14ps_avx512vl(auVar133);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = &DAT_3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar37._16_4_ = 0x3f800000;
              auVar37._20_4_ = 0x3f800000;
              auVar37._24_4_ = 0x3f800000;
              auVar37._28_4_ = 0x3f800000;
              auVar132 = vfnmadd213ps_avx512vl(auVar134,auVar133,auVar37);
              auVar114 = vfmadd132ps_fma(auVar132,auVar134,auVar134);
              auVar76._4_4_ = auVar6._4_4_ * auVar152._4_4_;
              auVar76._0_4_ = auVar6._0_4_ * auVar152._0_4_;
              auVar76._8_4_ = auVar6._8_4_ * auVar152._8_4_;
              auVar76._12_4_ = auVar6._12_4_ * auVar152._12_4_;
              auVar76._16_4_ = fVar201 * 0.0;
              auVar76._20_4_ = fVar169 * 0.0;
              auVar76._24_4_ = fVar206 * 0.0;
              auVar76._28_4_ = iVar1;
              auVar111 = vfmadd231ps_fma(auVar76,auVar120,ZEXT1632(auVar111));
              auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar130,ZEXT1632(auVar233));
              fVar201 = auVar114._0_4_;
              fVar169 = auVar114._4_4_;
              fVar206 = auVar114._8_4_;
              fVar207 = auVar114._12_4_;
              auVar134 = ZEXT1632(CONCAT412(auVar111._12_4_ * fVar207,
                                            CONCAT48(auVar111._8_4_ * fVar206,
                                                     CONCAT44(auVar111._4_4_ * fVar169,
                                                              auVar111._0_4_ * fVar201))));
              auVar97._4_4_ = uStack_7bc;
              auVar97._0_4_ = local_7c0;
              auVar97._8_4_ = uStack_7b8;
              auVar97._12_4_ = uStack_7b4;
              auVar97._16_4_ = uStack_7b0;
              auVar97._20_4_ = uStack_7ac;
              auVar97._24_4_ = uStack_7a8;
              auVar97._28_4_ = uStack_7a4;
              uVar171 = vcmpps_avx512vl(auVar134,auVar97,0xd);
              uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar38._4_4_ = uVar170;
              auVar38._0_4_ = uVar170;
              auVar38._8_4_ = uVar170;
              auVar38._12_4_ = uVar170;
              auVar38._16_4_ = uVar170;
              auVar38._20_4_ = uVar170;
              auVar38._24_4_ = uVar170;
              auVar38._28_4_ = uVar170;
              uVar30 = vcmpps_avx512vl(auVar134,auVar38,2);
              local_670 = (byte)uVar171 & (byte)uVar30 & local_670;
              if (local_670 == 0) goto LAB_01d24e02;
              uVar171 = vcmpps_avx512vl(auVar133,auVar129,4);
              if ((local_670 & (byte)uVar171) == 0) {
                local_670 = 0;
              }
              else {
                local_670 = local_670 & (byte)uVar171;
                fVar190 = auVar126._0_4_ * fVar201;
                fVar200 = auVar126._4_4_ * fVar169;
                auVar77._4_4_ = fVar200;
                auVar77._0_4_ = fVar190;
                fVar109 = auVar126._8_4_ * fVar206;
                auVar77._8_4_ = fVar109;
                fVar110 = auVar126._12_4_ * fVar207;
                auVar77._12_4_ = fVar110;
                fVar189 = auVar126._16_4_ * 0.0;
                auVar77._16_4_ = fVar189;
                fVar161 = auVar126._20_4_ * 0.0;
                auVar77._20_4_ = fVar161;
                fVar162 = auVar126._24_4_ * 0.0;
                auVar77._24_4_ = fVar162;
                auVar77._28_4_ = auVar126._28_4_;
                fVar201 = auVar127._0_4_ * fVar201;
                fVar169 = auVar127._4_4_ * fVar169;
                auVar78._4_4_ = fVar169;
                auVar78._0_4_ = fVar201;
                fVar206 = auVar127._8_4_ * fVar206;
                auVar78._8_4_ = fVar206;
                fVar207 = auVar127._12_4_ * fVar207;
                auVar78._12_4_ = fVar207;
                fVar163 = auVar127._16_4_ * 0.0;
                auVar78._16_4_ = fVar163;
                fVar165 = auVar127._20_4_ * 0.0;
                auVar78._20_4_ = fVar165;
                fVar166 = auVar127._24_4_ * 0.0;
                auVar78._24_4_ = fVar166;
                auVar78._28_4_ = auVar127._28_4_;
                auVar213._8_4_ = 0x3f800000;
                auVar213._0_8_ = &DAT_3f8000003f800000;
                auVar213._12_4_ = 0x3f800000;
                auVar213._16_4_ = 0x3f800000;
                auVar213._20_4_ = 0x3f800000;
                auVar213._24_4_ = 0x3f800000;
                auVar213._28_4_ = 0x3f800000;
                auVar133 = vsubps_avx512vl(auVar213,auVar77);
                bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar100 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar100 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar100 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar100 >> 6) & 1);
                bVar21 = SUB81(uVar100 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar21 * auVar126._28_4_ |
                                              (uint)!bVar21 * auVar133._28_4_,
                                              CONCAT424((uint)bVar20 * (int)fVar162 |
                                                        (uint)!bVar20 * auVar133._24_4_,
                                                        CONCAT420((uint)bVar19 * (int)fVar161 |
                                                                  (uint)!bVar19 * auVar133._20_4_,
                                                                  CONCAT416((uint)bVar18 *
                                                                            (int)fVar189 |
                                                                            (uint)!bVar18 *
                                                                            auVar133._16_4_,
                                                                            CONCAT412((uint)bVar17 *
                                                                                      (int)fVar110 |
                                                                                      (uint)!bVar17
                                                                                      * auVar133.
                                                  _12_4_,CONCAT48((uint)bVar16 * (int)fVar109 |
                                                                  (uint)!bVar16 * auVar133._8_4_,
                                                                  CONCAT44((uint)bVar15 *
                                                                           (int)fVar200 |
                                                                           (uint)!bVar15 *
                                                                           auVar133._4_4_,
                                                                           (uint)(bVar108 & 1) *
                                                                           (int)fVar190 |
                                                                           (uint)!(bool)(bVar108 & 1
                                                                                        ) *
                                                                           auVar133._0_4_))))))));
                auVar133 = vsubps_avx(auVar213,auVar78);
                bVar15 = (bool)((byte)(uVar100 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar100 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar100 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar100 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar100 >> 6) & 1);
                bVar21 = SUB81(uVar100 >> 7,0);
                local_5c0._4_4_ = (uint)bVar15 * (int)fVar169 | (uint)!bVar15 * auVar133._4_4_;
                local_5c0._0_4_ =
                     (uint)(bVar108 & 1) * (int)fVar201 |
                     (uint)!(bool)(bVar108 & 1) * auVar133._0_4_;
                local_5c0._8_4_ = (uint)bVar16 * (int)fVar206 | (uint)!bVar16 * auVar133._8_4_;
                local_5c0._12_4_ = (uint)bVar17 * (int)fVar207 | (uint)!bVar17 * auVar133._12_4_;
                local_5c0._16_4_ = (uint)bVar18 * (int)fVar163 | (uint)!bVar18 * auVar133._16_4_;
                local_5c0._20_4_ = (uint)bVar19 * (int)fVar165 | (uint)!bVar19 * auVar133._20_4_;
                local_5c0._24_4_ = (uint)bVar20 * (int)fVar166 | (uint)!bVar20 * auVar133._24_4_;
                local_5c0._28_4_ = (uint)bVar21 * auVar127._28_4_ | (uint)!bVar21 * auVar133._28_4_;
                in_ZMM21 = ZEXT3264(auVar134);
              }
            }
            auVar230 = ZEXT3264(local_900);
            if (local_670 != 0) {
              auVar133 = vsubps_avx(ZEXT1632(auVar113),auVar118);
              local_840 = in_ZMM20._0_32_;
              auVar133 = vfmadd213ps_avx512vl(auVar133,local_840,auVar118);
              auVar178._0_4_ = auVar133._0_4_ + auVar133._0_4_;
              auVar178._4_4_ = auVar133._4_4_ + auVar133._4_4_;
              auVar178._8_4_ = auVar133._8_4_ + auVar133._8_4_;
              auVar178._12_4_ = auVar133._12_4_ + auVar133._12_4_;
              auVar178._16_4_ = auVar133._16_4_ + auVar133._16_4_;
              auVar178._20_4_ = auVar133._20_4_ + auVar133._20_4_;
              auVar178._24_4_ = auVar133._24_4_ + auVar133._24_4_;
              auVar178._28_4_ = auVar133._28_4_ + auVar133._28_4_;
              uVar170 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar39._4_4_ = uVar170;
              auVar39._0_4_ = uVar170;
              auVar39._8_4_ = uVar170;
              auVar39._12_4_ = uVar170;
              auVar39._16_4_ = uVar170;
              auVar39._20_4_ = uVar170;
              auVar39._24_4_ = uVar170;
              auVar39._28_4_ = uVar170;
              auVar133 = vmulps_avx512vl(auVar178,auVar39);
              local_860 = in_ZMM21._0_32_;
              uVar171 = vcmpps_avx512vl(local_860,auVar133,6);
              local_670 = local_670 & (byte)uVar171;
              if (local_670 != 0) {
                auVar179._8_4_ = 0xbf800000;
                auVar179._0_8_ = 0xbf800000bf800000;
                auVar179._12_4_ = 0xbf800000;
                auVar179._16_4_ = 0xbf800000;
                auVar179._20_4_ = 0xbf800000;
                auVar179._24_4_ = 0xbf800000;
                auVar179._28_4_ = 0xbf800000;
                auVar40._8_4_ = 0x40000000;
                auVar40._0_8_ = 0x4000000040000000;
                auVar40._12_4_ = 0x40000000;
                auVar40._16_4_ = 0x40000000;
                auVar40._20_4_ = 0x40000000;
                auVar40._24_4_ = 0x40000000;
                auVar40._28_4_ = 0x40000000;
                local_700 = vfmadd132ps_avx512vl(local_5c0,auVar179,auVar40);
                local_5c0 = local_700;
                auVar133 = local_5c0;
                local_6c0 = (undefined4)lVar105;
                local_6a0 = local_8b0._0_8_;
                uStack_698 = local_8b0._8_8_;
                local_690 = local_8c0._0_8_;
                uStack_688 = local_8c0._8_8_;
                local_680 = local_8d0;
                uStack_678 = uStack_8c8;
                pGVar12 = (context->scene->geometries).items[uVar106].ptr;
                local_5c0 = auVar133;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar133 = vaddps_avx512vl(local_840,_DAT_02020f40);
                  auVar114 = vcvtsi2ss_avx512f(auVar231._0_16_,local_6c0);
                  fVar201 = auVar114._0_4_;
                  local_660[0] = (fVar201 + auVar133._0_4_) * (float)local_7e0._0_4_;
                  local_660[1] = (fVar201 + auVar133._4_4_) * (float)local_7e0._4_4_;
                  local_660[2] = (fVar201 + auVar133._8_4_) * fStack_7d8;
                  local_660[3] = (fVar201 + auVar133._12_4_) * fStack_7d4;
                  fStack_650 = (fVar201 + auVar133._16_4_) * fStack_7d0;
                  fStack_64c = (fVar201 + auVar133._20_4_) * fStack_7cc;
                  fStack_648 = (fVar201 + auVar133._24_4_) * fStack_7c8;
                  fStack_644 = fVar201 + auVar133._28_4_;
                  local_5c0._0_8_ = local_700._0_8_;
                  local_5c0._8_8_ = local_700._8_8_;
                  local_5c0._16_8_ = local_700._16_8_;
                  local_5c0._24_8_ = local_700._24_8_;
                  local_640 = local_5c0._0_8_;
                  uStack_638 = local_5c0._8_8_;
                  uStack_630 = local_5c0._16_8_;
                  uStack_628 = local_5c0._24_8_;
                  local_620 = local_860;
                  auVar180._8_4_ = 0x7f800000;
                  auVar180._0_8_ = 0x7f8000007f800000;
                  auVar180._12_4_ = 0x7f800000;
                  auVar180._16_4_ = 0x7f800000;
                  auVar180._20_4_ = 0x7f800000;
                  auVar180._24_4_ = 0x7f800000;
                  auVar180._28_4_ = 0x7f800000;
                  auVar133 = vblendmps_avx512vl(auVar180,local_860);
                  auVar157._0_4_ =
                       (uint)(local_670 & 1) * auVar133._0_4_ |
                       (uint)!(bool)(local_670 & 1) * 0x7f800000;
                  bVar15 = (bool)(local_670 >> 1 & 1);
                  auVar157._4_4_ = (uint)bVar15 * auVar133._4_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_670 >> 2 & 1);
                  auVar157._8_4_ = (uint)bVar15 * auVar133._8_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_670 >> 3 & 1);
                  auVar157._12_4_ = (uint)bVar15 * auVar133._12_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_670 >> 4 & 1);
                  auVar157._16_4_ = (uint)bVar15 * auVar133._16_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_670 >> 5 & 1);
                  auVar157._20_4_ = (uint)bVar15 * auVar133._20_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_670 >> 6 & 1);
                  auVar157._24_4_ = (uint)bVar15 * auVar133._24_4_ | (uint)!bVar15 * 0x7f800000;
                  auVar157._28_4_ =
                       (uint)(local_670 >> 7) * auVar133._28_4_ |
                       (uint)!(bool)(local_670 >> 7) * 0x7f800000;
                  auVar133 = vshufps_avx(auVar157,auVar157,0xb1);
                  auVar133 = vminps_avx(auVar157,auVar133);
                  auVar134 = vshufpd_avx(auVar133,auVar133,5);
                  auVar133 = vminps_avx(auVar133,auVar134);
                  auVar134 = vpermpd_avx2(auVar133,0x4e);
                  auVar133 = vminps_avx(auVar133,auVar134);
                  uVar171 = vcmpps_avx512vl(auVar157,auVar133,0);
                  bVar99 = (byte)uVar171 & local_670;
                  bVar108 = local_670;
                  if (bVar99 != 0) {
                    bVar108 = bVar99;
                  }
                  uVar219 = 0;
                  for (uVar102 = (uint)bVar108; (uVar102 & 1) == 0;
                      uVar102 = uVar102 >> 1 | 0x80000000) {
                    uVar219 = uVar219 + 1;
                  }
                  uVar100 = (ulong)uVar219;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar201 = local_660[uVar100];
                    uVar170 = *(undefined4 *)((long)&local_640 + uVar100 * 4);
                    fVar206 = 1.0 - fVar201;
                    fVar169 = fVar206 * fVar206 * -3.0;
                    auVar114 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),
                                               ZEXT416((uint)(fVar201 * fVar206)),
                                               ZEXT416(0xc0000000));
                    auVar113 = vfmsub132ss_fma(ZEXT416((uint)(fVar201 * fVar206)),
                                               ZEXT416((uint)(fVar201 * fVar201)),
                                               ZEXT416(0x40000000));
                    fVar206 = auVar114._0_4_ * 3.0;
                    fVar207 = auVar113._0_4_ * 3.0;
                    fVar190 = fVar201 * fVar201 * 3.0;
                    auVar209._0_4_ = fVar190 * (float)local_8d0._0_4_;
                    auVar209._4_4_ = fVar190 * (float)local_8d0._4_4_;
                    auVar209._8_4_ = fVar190 * (float)uStack_8c8;
                    auVar209._12_4_ = fVar190 * uStack_8c8._4_4_;
                    auVar187._4_4_ = fVar207;
                    auVar187._0_4_ = fVar207;
                    auVar187._8_4_ = fVar207;
                    auVar187._12_4_ = fVar207;
                    auVar114 = vfmadd132ps_fma(auVar187,auVar209,local_8c0);
                    auVar194._4_4_ = fVar206;
                    auVar194._0_4_ = fVar206;
                    auVar194._8_4_ = fVar206;
                    auVar194._12_4_ = fVar206;
                    auVar114 = vfmadd132ps_fma(auVar194,auVar114,local_8b0);
                    auVar188._4_4_ = fVar169;
                    auVar188._0_4_ = fVar169;
                    auVar188._8_4_ = fVar169;
                    auVar188._12_4_ = fVar169;
                    auVar114 = vfmadd213ps_fma(auVar188,auVar29,auVar114);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar100 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar114._0_4_;
                    uVar11 = vextractps_avx(auVar114,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar11;
                    uVar11 = vextractps_avx(auVar114,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar11;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar201;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar170;
                    *(undefined4 *)(ray + k * 4 + 0x440) = uVar3;
                    *(uint *)(ray + k * 4 + 0x480) = uVar106;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_800 = local_8b0._0_8_;
                    uStack_7f8 = local_8b0._8_8_;
                    local_810 = local_8c0._0_4_;
                    fStack_80c = local_8c0._4_4_;
                    fStack_808 = local_8c0._8_4_;
                    fStack_804 = local_8c0._12_4_;
                    local_550 = local_8d0;
                    uStack_548 = uStack_8c8;
                    local_910 = lVar105;
                    local_720 = local_840;
                    local_6e0 = local_860;
                    local_6bc = iVar10;
                    local_6b0 = auVar29;
                    bVar108 = local_670;
                    do {
                      auVar199 = local_500;
                      local_500._1_3_ = 0;
                      local_500[0] = bVar108;
                      auVar111 = auVar234._0_16_;
                      local_500._4_60_ = auVar199._4_60_;
                      local_7f0 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar100]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_640 + uVar100 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_620 + uVar100 * 4);
                      local_940.context = context->user;
                      fVar207 = local_200._0_4_;
                      fVar169 = 1.0 - fVar207;
                      fVar201 = fVar169 * fVar169 * -3.0;
                      auVar114 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169)),
                                                 ZEXT416((uint)(fVar207 * fVar169)),
                                                 ZEXT416(0xc0000000));
                      auVar113 = vfmsub132ss_fma(ZEXT416((uint)(fVar207 * fVar169)),
                                                 ZEXT416((uint)(fVar207 * fVar207)),
                                                 ZEXT416(0x40000000));
                      fVar169 = auVar114._0_4_ * 3.0;
                      fVar206 = auVar113._0_4_ * 3.0;
                      fVar207 = fVar207 * fVar207 * 3.0;
                      auVar210._0_4_ = fVar207 * (float)local_550;
                      auVar210._4_4_ = fVar207 * local_550._4_4_;
                      auVar210._8_4_ = fVar207 * (float)uStack_548;
                      auVar210._12_4_ = fVar207 * uStack_548._4_4_;
                      auVar172._4_4_ = fVar206;
                      auVar172._0_4_ = fVar206;
                      auVar172._8_4_ = fVar206;
                      auVar172._12_4_ = fVar206;
                      auVar93._4_4_ = fStack_80c;
                      auVar93._0_4_ = local_810;
                      auVar93._8_4_ = fStack_808;
                      auVar93._12_4_ = fStack_804;
                      auVar114 = vfmadd132ps_fma(auVar172,auVar210,auVar93);
                      auVar195._4_4_ = fVar169;
                      auVar195._0_4_ = fVar169;
                      auVar195._8_4_ = fVar169;
                      auVar195._12_4_ = fVar169;
                      auVar94._8_8_ = uStack_7f8;
                      auVar94._0_8_ = local_800;
                      auVar114 = vfmadd132ps_fma(auVar195,auVar114,auVar94);
                      auVar173._4_4_ = fVar201;
                      auVar173._0_4_ = fVar201;
                      auVar173._8_4_ = fVar201;
                      auVar173._12_4_ = fVar201;
                      auVar114 = vfmadd213ps_fma(auVar173,auVar29,auVar114);
                      auVar199 = vbroadcastss_avx512f(auVar114);
                      auVar216 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar216,ZEXT1664(auVar114));
                      auVar216 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar216,ZEXT1664(auVar114));
                      local_2c0[0] = (RTCHitN)auVar199[0];
                      local_2c0[1] = (RTCHitN)auVar199[1];
                      local_2c0[2] = (RTCHitN)auVar199[2];
                      local_2c0[3] = (RTCHitN)auVar199[3];
                      local_2c0[4] = (RTCHitN)auVar199[4];
                      local_2c0[5] = (RTCHitN)auVar199[5];
                      local_2c0[6] = (RTCHitN)auVar199[6];
                      local_2c0[7] = (RTCHitN)auVar199[7];
                      local_2c0[8] = (RTCHitN)auVar199[8];
                      local_2c0[9] = (RTCHitN)auVar199[9];
                      local_2c0[10] = (RTCHitN)auVar199[10];
                      local_2c0[0xb] = (RTCHitN)auVar199[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar199[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar199[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar199[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar199[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar199[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar199[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar199[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar199[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar199[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar199[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar199[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar199[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar199[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar199[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar199[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar199[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar199[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar199[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar199[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar199[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar199[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar199[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar199[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar199[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar199[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar199[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar199[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar199[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar199[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar199[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar199[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar199[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar199[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar199[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar199[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar199[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar199[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar199[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar199[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar199[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar199[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar199[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar199[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar199[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar199[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar199[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar199[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar199[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar199[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar199[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar199[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar199[0x3f];
                      local_180 = local_4c0._0_8_;
                      uStack_178 = local_4c0._8_8_;
                      uStack_170 = local_4c0._16_8_;
                      uStack_168 = local_4c0._24_8_;
                      uStack_160 = local_4c0._32_8_;
                      uStack_158 = local_4c0._40_8_;
                      uStack_150 = local_4c0._48_8_;
                      uStack_148 = local_4c0._56_8_;
                      auVar199 = vmovdqa64_avx512f(local_540);
                      local_140 = vmovdqa64_avx512f(auVar199);
                      auVar133 = vpcmpeqd_avx2(auVar199._0_32_,auVar199._0_32_);
                      local_908[3] = auVar133;
                      local_908[2] = auVar133;
                      local_908[1] = auVar133;
                      *local_908 = auVar133;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_940.context)->instPrimID[0]));
                      local_600 = local_300;
                      local_940.valid = (int *)local_600;
                      local_940.geometryUserPtr = pGVar12->userPtr;
                      local_940.hit = local_2c0;
                      local_940.N = 0x10;
                      local_940.ray = (RTCRayN *)ray;
                      if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar12->intersectionFilterN)(&local_940);
                        auVar235 = ZEXT3264(local_8a0);
                        auVar183 = ZEXT3264(local_880);
                        auVar230 = ZEXT3264(local_900);
                        auVar160 = ZEXT3264(local_780);
                        auVar232 = ZEXT3264(local_760);
                        in_ZMM21 = ZEXT3264(local_860);
                        in_ZMM20 = ZEXT3264(local_840);
                        auVar114 = vxorps_avx512vl(auVar111,auVar111);
                        auVar234 = ZEXT1664(auVar114);
                        lVar105 = local_910;
                      }
                      auVar114 = auVar234._0_16_;
                      auVar199 = vmovdqa64_avx512f(local_600);
                      uVar171 = vptestmd_avx512f(auVar199,auVar199);
                      if ((short)uVar171 == 0) {
LAB_01d2524a:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_7f0;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&local_940);
                          auVar235 = ZEXT3264(local_8a0);
                          auVar183 = ZEXT3264(local_880);
                          auVar230 = ZEXT3264(local_900);
                          auVar160 = ZEXT3264(local_780);
                          auVar232 = ZEXT3264(local_760);
                          in_ZMM21 = ZEXT3264(local_860);
                          in_ZMM20 = ZEXT3264(local_840);
                          auVar114 = vxorps_avx512vl(auVar114,auVar114);
                          auVar234 = ZEXT1664(auVar114);
                          lVar105 = local_910;
                        }
                        auVar199 = vmovdqa64_avx512f(local_600);
                        uVar104 = vptestmd_avx512f(auVar199,auVar199);
                        if ((short)uVar104 == 0) goto LAB_01d2524a;
                        iVar1 = *(int *)(local_940.hit + 4);
                        iVar2 = *(int *)(local_940.hit + 8);
                        iVar80 = *(int *)(local_940.hit + 0xc);
                        iVar81 = *(int *)(local_940.hit + 0x10);
                        iVar82 = *(int *)(local_940.hit + 0x14);
                        iVar83 = *(int *)(local_940.hit + 0x18);
                        iVar84 = *(int *)(local_940.hit + 0x1c);
                        iVar85 = *(int *)(local_940.hit + 0x20);
                        iVar86 = *(int *)(local_940.hit + 0x24);
                        iVar87 = *(int *)(local_940.hit + 0x28);
                        iVar88 = *(int *)(local_940.hit + 0x2c);
                        iVar89 = *(int *)(local_940.hit + 0x30);
                        iVar90 = *(int *)(local_940.hit + 0x34);
                        iVar91 = *(int *)(local_940.hit + 0x38);
                        iVar92 = *(int *)(local_940.hit + 0x3c);
                        bVar108 = (byte)uVar104;
                        bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                        bVar99 = (byte)(uVar104 >> 8);
                        bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                        bVar28 = SUB81(uVar104 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x300) =
                             (uint)(bVar108 & 1) * *(int *)local_940.hit |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_940.ray + 0x300);
                        *(uint *)(local_940.ray + 0x304) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x304);
                        *(uint *)(local_940.ray + 0x308) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x308);
                        *(uint *)(local_940.ray + 0x30c) =
                             (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x30c)
                        ;
                        *(uint *)(local_940.ray + 0x310) =
                             (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x310)
                        ;
                        *(uint *)(local_940.ray + 0x314) =
                             (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x314)
                        ;
                        *(uint *)(local_940.ray + 0x318) =
                             (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x318)
                        ;
                        *(uint *)(local_940.ray + 0x31c) =
                             (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x31c)
                        ;
                        *(uint *)(local_940.ray + 800) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 800);
                        *(uint *)(local_940.ray + 0x324) =
                             (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x324)
                        ;
                        *(uint *)(local_940.ray + 0x328) =
                             (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x328)
                        ;
                        *(uint *)(local_940.ray + 0x32c) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x32c)
                        ;
                        *(uint *)(local_940.ray + 0x330) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x330)
                        ;
                        *(uint *)(local_940.ray + 0x334) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x334)
                        ;
                        *(uint *)(local_940.ray + 0x338) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x338)
                        ;
                        *(uint *)(local_940.ray + 0x33c) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0x44);
                        iVar2 = *(int *)(local_940.hit + 0x48);
                        iVar80 = *(int *)(local_940.hit + 0x4c);
                        iVar81 = *(int *)(local_940.hit + 0x50);
                        iVar82 = *(int *)(local_940.hit + 0x54);
                        iVar83 = *(int *)(local_940.hit + 0x58);
                        iVar84 = *(int *)(local_940.hit + 0x5c);
                        iVar85 = *(int *)(local_940.hit + 0x60);
                        iVar86 = *(int *)(local_940.hit + 100);
                        iVar87 = *(int *)(local_940.hit + 0x68);
                        iVar88 = *(int *)(local_940.hit + 0x6c);
                        iVar89 = *(int *)(local_940.hit + 0x70);
                        iVar90 = *(int *)(local_940.hit + 0x74);
                        iVar91 = *(int *)(local_940.hit + 0x78);
                        iVar92 = *(int *)(local_940.hit + 0x7c);
                        bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                        bVar28 = SUB81(uVar104 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x340) =
                             (uint)(bVar108 & 1) * *(int *)(local_940.hit + 0x40) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_940.ray + 0x340);
                        *(uint *)(local_940.ray + 0x344) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x344);
                        *(uint *)(local_940.ray + 0x348) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x348);
                        *(uint *)(local_940.ray + 0x34c) =
                             (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x34c)
                        ;
                        *(uint *)(local_940.ray + 0x350) =
                             (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x350)
                        ;
                        *(uint *)(local_940.ray + 0x354) =
                             (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x354)
                        ;
                        *(uint *)(local_940.ray + 0x358) =
                             (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x358)
                        ;
                        *(uint *)(local_940.ray + 0x35c) =
                             (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x35c)
                        ;
                        *(uint *)(local_940.ray + 0x360) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x360);
                        *(uint *)(local_940.ray + 0x364) =
                             (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x364)
                        ;
                        *(uint *)(local_940.ray + 0x368) =
                             (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x368)
                        ;
                        *(uint *)(local_940.ray + 0x36c) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x36c)
                        ;
                        *(uint *)(local_940.ray + 0x370) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x370)
                        ;
                        *(uint *)(local_940.ray + 0x374) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x374)
                        ;
                        *(uint *)(local_940.ray + 0x378) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x378)
                        ;
                        *(uint *)(local_940.ray + 0x37c) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0x84);
                        iVar2 = *(int *)(local_940.hit + 0x88);
                        iVar80 = *(int *)(local_940.hit + 0x8c);
                        iVar81 = *(int *)(local_940.hit + 0x90);
                        iVar82 = *(int *)(local_940.hit + 0x94);
                        iVar83 = *(int *)(local_940.hit + 0x98);
                        iVar84 = *(int *)(local_940.hit + 0x9c);
                        iVar85 = *(int *)(local_940.hit + 0xa0);
                        iVar86 = *(int *)(local_940.hit + 0xa4);
                        iVar87 = *(int *)(local_940.hit + 0xa8);
                        iVar88 = *(int *)(local_940.hit + 0xac);
                        iVar89 = *(int *)(local_940.hit + 0xb0);
                        iVar90 = *(int *)(local_940.hit + 0xb4);
                        iVar91 = *(int *)(local_940.hit + 0xb8);
                        iVar92 = *(int *)(local_940.hit + 0xbc);
                        bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                        bVar28 = SUB81(uVar104 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x380) =
                             (uint)(bVar108 & 1) * *(int *)(local_940.hit + 0x80) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_940.ray + 0x380);
                        *(uint *)(local_940.ray + 900) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 900);
                        *(uint *)(local_940.ray + 0x388) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x388);
                        *(uint *)(local_940.ray + 0x38c) =
                             (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x38c)
                        ;
                        *(uint *)(local_940.ray + 0x390) =
                             (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x390)
                        ;
                        *(uint *)(local_940.ray + 0x394) =
                             (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x394)
                        ;
                        *(uint *)(local_940.ray + 0x398) =
                             (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x398)
                        ;
                        *(uint *)(local_940.ray + 0x39c) =
                             (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x39c)
                        ;
                        *(uint *)(local_940.ray + 0x3a0) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x3a0);
                        *(uint *)(local_940.ray + 0x3a4) =
                             (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x3a4)
                        ;
                        *(uint *)(local_940.ray + 0x3a8) =
                             (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x3a8)
                        ;
                        *(uint *)(local_940.ray + 0x3ac) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3ac)
                        ;
                        *(uint *)(local_940.ray + 0x3b0) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3b0)
                        ;
                        *(uint *)(local_940.ray + 0x3b4) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3b4)
                        ;
                        *(uint *)(local_940.ray + 0x3b8) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3b8)
                        ;
                        *(uint *)(local_940.ray + 0x3bc) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0xc4);
                        iVar2 = *(int *)(local_940.hit + 200);
                        iVar80 = *(int *)(local_940.hit + 0xcc);
                        iVar81 = *(int *)(local_940.hit + 0xd0);
                        iVar82 = *(int *)(local_940.hit + 0xd4);
                        iVar83 = *(int *)(local_940.hit + 0xd8);
                        iVar84 = *(int *)(local_940.hit + 0xdc);
                        iVar85 = *(int *)(local_940.hit + 0xe0);
                        iVar86 = *(int *)(local_940.hit + 0xe4);
                        iVar87 = *(int *)(local_940.hit + 0xe8);
                        iVar88 = *(int *)(local_940.hit + 0xec);
                        iVar89 = *(int *)(local_940.hit + 0xf0);
                        iVar90 = *(int *)(local_940.hit + 0xf4);
                        iVar91 = *(int *)(local_940.hit + 0xf8);
                        iVar92 = *(int *)(local_940.hit + 0xfc);
                        bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                        bVar28 = SUB81(uVar104 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x3c0) =
                             (uint)(bVar108 & 1) * *(int *)(local_940.hit + 0xc0) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_940.ray + 0x3c0);
                        *(uint *)(local_940.ray + 0x3c4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x3c4);
                        *(uint *)(local_940.ray + 0x3c8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x3c8);
                        *(uint *)(local_940.ray + 0x3cc) =
                             (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x3cc)
                        ;
                        *(uint *)(local_940.ray + 0x3d0) =
                             (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x3d0)
                        ;
                        *(uint *)(local_940.ray + 0x3d4) =
                             (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x3d4)
                        ;
                        *(uint *)(local_940.ray + 0x3d8) =
                             (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x3d8)
                        ;
                        *(uint *)(local_940.ray + 0x3dc) =
                             (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x3dc)
                        ;
                        *(uint *)(local_940.ray + 0x3e0) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x3e0);
                        *(uint *)(local_940.ray + 0x3e4) =
                             (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x3e4)
                        ;
                        *(uint *)(local_940.ray + 1000) =
                             (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 1000);
                        *(uint *)(local_940.ray + 0x3ec) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x3ec)
                        ;
                        *(uint *)(local_940.ray + 0x3f0) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x3f0)
                        ;
                        *(uint *)(local_940.ray + 0x3f4) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x3f4)
                        ;
                        *(uint *)(local_940.ray + 0x3f8) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x3f8)
                        ;
                        *(uint *)(local_940.ray + 0x3fc) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_940.hit + 0x104);
                        iVar2 = *(int *)(local_940.hit + 0x108);
                        iVar80 = *(int *)(local_940.hit + 0x10c);
                        iVar81 = *(int *)(local_940.hit + 0x110);
                        iVar82 = *(int *)(local_940.hit + 0x114);
                        iVar83 = *(int *)(local_940.hit + 0x118);
                        iVar84 = *(int *)(local_940.hit + 0x11c);
                        iVar85 = *(int *)(local_940.hit + 0x120);
                        iVar86 = *(int *)(local_940.hit + 0x124);
                        iVar87 = *(int *)(local_940.hit + 0x128);
                        iVar88 = *(int *)(local_940.hit + 300);
                        iVar89 = *(int *)(local_940.hit + 0x130);
                        iVar90 = *(int *)(local_940.hit + 0x134);
                        iVar91 = *(int *)(local_940.hit + 0x138);
                        iVar92 = *(int *)(local_940.hit + 0x13c);
                        bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar104 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar104 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar104 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar104 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar104 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar104 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar104 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar104 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar104 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar104 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar104 >> 0xe) & 1);
                        bVar28 = SUB81(uVar104 >> 0xf,0);
                        *(uint *)(local_940.ray + 0x400) =
                             (uint)(bVar108 & 1) * *(int *)(local_940.hit + 0x100) |
                             (uint)!(bool)(bVar108 & 1) * *(int *)(local_940.ray + 0x400);
                        *(uint *)(local_940.ray + 0x404) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_940.ray + 0x404);
                        *(uint *)(local_940.ray + 0x408) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_940.ray + 0x408);
                        *(uint *)(local_940.ray + 0x40c) =
                             (uint)bVar17 * iVar80 | (uint)!bVar17 * *(int *)(local_940.ray + 0x40c)
                        ;
                        *(uint *)(local_940.ray + 0x410) =
                             (uint)bVar18 * iVar81 | (uint)!bVar18 * *(int *)(local_940.ray + 0x410)
                        ;
                        *(uint *)(local_940.ray + 0x414) =
                             (uint)bVar19 * iVar82 | (uint)!bVar19 * *(int *)(local_940.ray + 0x414)
                        ;
                        *(uint *)(local_940.ray + 0x418) =
                             (uint)bVar20 * iVar83 | (uint)!bVar20 * *(int *)(local_940.ray + 0x418)
                        ;
                        *(uint *)(local_940.ray + 0x41c) =
                             (uint)bVar21 * iVar84 | (uint)!bVar21 * *(int *)(local_940.ray + 0x41c)
                        ;
                        *(uint *)(local_940.ray + 0x420) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_940.ray + 0x420);
                        *(uint *)(local_940.ray + 0x424) =
                             (uint)bVar22 * iVar86 | (uint)!bVar22 * *(int *)(local_940.ray + 0x424)
                        ;
                        *(uint *)(local_940.ray + 0x428) =
                             (uint)bVar23 * iVar87 | (uint)!bVar23 * *(int *)(local_940.ray + 0x428)
                        ;
                        *(uint *)(local_940.ray + 0x42c) =
                             (uint)bVar24 * iVar88 | (uint)!bVar24 * *(int *)(local_940.ray + 0x42c)
                        ;
                        *(uint *)(local_940.ray + 0x430) =
                             (uint)bVar25 * iVar89 | (uint)!bVar25 * *(int *)(local_940.ray + 0x430)
                        ;
                        *(uint *)(local_940.ray + 0x434) =
                             (uint)bVar26 * iVar90 | (uint)!bVar26 * *(int *)(local_940.ray + 0x434)
                        ;
                        *(uint *)(local_940.ray + 0x438) =
                             (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_940.ray + 0x438)
                        ;
                        *(uint *)(local_940.ray + 0x43c) =
                             (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_940.ray + 0x43c)
                        ;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x140));
                        auVar199 = vmovdqu32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x440) = auVar199;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x180));
                        auVar199 = vmovdqu32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x480) = auVar199;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x1c0));
                        auVar199 = vmovdqa32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x4c0) = auVar199;
                        auVar199 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_940.hit + 0x200));
                        auVar199 = vmovdqa32_avx512f(auVar199);
                        *(undefined1 (*) [64])(local_940.ray + 0x500) = auVar199;
                      }
                      bVar99 = ~(byte)(1 << ((uint)uVar100 & 0x1f)) & local_500[0];
                      uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar41._4_4_ = uVar170;
                      auVar41._0_4_ = uVar170;
                      auVar41._8_4_ = uVar170;
                      auVar41._12_4_ = uVar170;
                      auVar41._16_4_ = uVar170;
                      auVar41._20_4_ = uVar170;
                      auVar41._24_4_ = uVar170;
                      auVar41._28_4_ = uVar170;
                      uVar171 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar41,2);
                      bVar108 = bVar99 & (byte)uVar171;
                      if ((bVar99 & (byte)uVar171) != 0) {
                        auVar181._8_4_ = 0x7f800000;
                        auVar181._0_8_ = 0x7f8000007f800000;
                        auVar181._12_4_ = 0x7f800000;
                        auVar181._16_4_ = 0x7f800000;
                        auVar181._20_4_ = 0x7f800000;
                        auVar181._24_4_ = 0x7f800000;
                        auVar181._28_4_ = 0x7f800000;
                        auVar133 = vblendmps_avx512vl(auVar181,in_ZMM21._0_32_);
                        auVar158._0_4_ =
                             (uint)(bVar108 & 1) * auVar133._0_4_ |
                             (uint)!(bool)(bVar108 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar108 >> 1 & 1);
                        auVar158._4_4_ = (uint)bVar15 * auVar133._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar108 >> 2 & 1);
                        auVar158._8_4_ = (uint)bVar15 * auVar133._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar108 >> 3 & 1);
                        auVar158._12_4_ =
                             (uint)bVar15 * auVar133._12_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar108 >> 4 & 1);
                        auVar158._16_4_ =
                             (uint)bVar15 * auVar133._16_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar108 >> 5 & 1);
                        auVar158._20_4_ =
                             (uint)bVar15 * auVar133._20_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar108 >> 6 & 1);
                        auVar158._24_4_ =
                             (uint)bVar15 * auVar133._24_4_ | (uint)!bVar15 * 0x7f800000;
                        auVar158._28_4_ =
                             (uint)(bVar108 >> 7) * auVar133._28_4_ |
                             (uint)!(bool)(bVar108 >> 7) * 0x7f800000;
                        auVar133 = vshufps_avx(auVar158,auVar158,0xb1);
                        auVar133 = vminps_avx(auVar158,auVar133);
                        auVar134 = vshufpd_avx(auVar133,auVar133,5);
                        auVar133 = vminps_avx(auVar133,auVar134);
                        auVar134 = vpermpd_avx2(auVar133,0x4e);
                        auVar133 = vminps_avx(auVar133,auVar134);
                        uVar171 = vcmpps_avx512vl(auVar158,auVar133,0);
                        bVar98 = (byte)uVar171 & bVar108;
                        bVar99 = bVar108;
                        if (bVar98 != 0) {
                          bVar99 = bVar98;
                        }
                        uVar219 = 0;
                        for (uVar102 = (uint)bVar99; (uVar102 & 1) == 0;
                            uVar102 = uVar102 >> 1 | 0x80000000) {
                          uVar219 = uVar219 + 1;
                        }
                        uVar100 = (ulong)uVar219;
                      }
                    } while (bVar108 != 0);
                  }
                }
              }
            }
          }
          auVar216 = ZEXT3264(auVar121);
          auVar199 = ZEXT3264(auVar123);
          lVar105 = lVar105 + 8;
          auVar231 = auVar160;
        } while ((int)lVar105 < iVar10);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar36._4_4_ = uVar3;
      auVar36._0_4_ = uVar3;
      auVar36._8_4_ = uVar3;
      auVar36._12_4_ = uVar3;
      auVar36._16_4_ = uVar3;
      auVar36._20_4_ = uVar3;
      auVar36._24_4_ = uVar3;
      auVar36._28_4_ = uVar3;
      uVar171 = vcmpps_avx512vl(local_320,auVar36,2);
      uVar106 = (uint)uVar107 & (uint)uVar171;
      uVar107 = (ulong)uVar106;
    } while (uVar106 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }